

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  st_ptls_esni_secret_t **esni;
  st_ptls_aead_context_t *psVar1;
  st_ptls_aead_context_t *end;
  uint8_t uVar2;
  byte bVar3;
  ushort uVar4;
  en_ptls_state_t eVar5;
  st_ptls_on_extension_t *psVar6;
  char *pcVar7;
  ptls_esni_context_t *ppVar8;
  ptls_hash_algorithm_t *hash;
  ptls_buffer_t *ppVar9;
  ptls_buffer_t *ppVar10;
  st_ptls_hash_context_t *psVar11;
  st_ptls_update_esni_key_t *psVar12;
  st_ptls_update_traffic_key_t *psVar13;
  size_t sVar14;
  anon_struct_72_2_510fbff9 *paVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  char cVar19;
  ptls_iovec_t pVar20;
  ptls_iovec_t ikm;
  ptls_iovec_t pubkey_00;
  ptls_iovec_t tbs;
  uint16_t uVar21;
  char cVar22;
  ptls_aead_context_t *ctx;
  ptls_key_exchange_algorithm_t *ppVar23;
  ushort uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  st_ptls_aead_context_t *psVar28;
  ushort *puVar29;
  ptls_context_t *ppVar30;
  size_t sVar31;
  st_ptls_esni_secret_t *psVar32;
  ptls_esni_context_t **pppVar33;
  ptls_key_schedule_t *ppVar34;
  uint8_t *puVar35;
  size_t sVar36;
  size_t sVar37;
  size_t sVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ptls_cipher_suite_t *ppVar42;
  ptls_hash_context_t **pppVar43;
  ptls_key_exchange_context_t *ppVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ptls_cipher_suite_t *ppVar48;
  long lVar49;
  long lVar50;
  st_ptls_aead_context_t *psVar51;
  long lVar52;
  size_t sVar53;
  size_t sVar54;
  size_t sVar55;
  st_ptls_aead_context_t *psVar56;
  ptls_cipher_suite_t **pppVar57;
  size_t *psVar58;
  uint16_t *puVar59;
  uint8_t *puVar60;
  uint8_t *puVar61;
  st_ptls_aead_context_t *psVar62;
  size_t sVar63;
  size_t sVar64;
  ptls_message_emitter_t *_emitter;
  bool bVar65;
  ptls_iovec_t pVar66;
  ptls_iovec_t tbs_00;
  ptls_iovec_t pVar67;
  ptls_iovec_t ch_trunc;
  size_t tbs_start;
  int accept_early_data;
  uint8_t finished_key [64];
  anon_struct_24_2_cc7b932a key_share;
  size_t psk_index;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  st_ptls_client_hello_t ch;
  size_t local_638;
  st_ptls_aead_context_t *local_630;
  ptls_key_schedule_t *local_628;
  st_ptls_key_exchange_context_t **local_618;
  size_t local_610;
  size_t local_5f0;
  ptls_aead_context_t *local_5d8;
  uint8_t auStack_5d0 [4];
  int local_5cc;
  ptls_on_client_hello_parameters_t local_5c8;
  ptls_key_exchange_algorithm_t *local_568;
  ptls_iovec_t pStack_560;
  size_t local_550;
  ptls_iovec_t local_548;
  ptls_iovec_t local_538;
  size_t local_528;
  uint8_t *local_520;
  st_ptls_client_hello_t local_518;
  
  uVar39 = message.len;
  puVar35 = message.base;
  memset(&local_518,0,0x4e8);
  local_518.unknown_extensions[0].type = 0xffff;
  local_568 = (ptls_key_exchange_algorithm_t *)0x0;
  pStack_560.base = (uint8_t *)0x0;
  pStack_560.len = 0;
  local_550 = 0xffffffffffffffff;
  local_538.base = (uint8_t *)0x0;
  local_538.len = 0;
  local_548.base = (uint8_t *)0x0;
  local_548.len = 0;
  local_5cc = 0;
  if ((tls->field_0x160 & 0x20) != 0) {
    local_518.psk.ke_modes = tls->handshake_ke_modes;
LAB_001156c8:
    iVar26 = send_certificate_and_certificate_verify
                       (tls,emitter,&local_518.signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                        "TLS 1.3, server CertificateVerify",(byte)local_518._1248_1_ & 1);
    if ((tls->field_0x160 & 0x20) != 0) {
      tls->handshake_ke_modes = local_518.psk.ke_modes;
      return 0x202;
    }
    if (iVar26 == 0) {
LAB_00115707:
      send_finished(tls,emitter);
      if (tls->key_schedule->generation != 2) {
        __assert_fail("tls->key_schedule->generation == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0xf6f,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      iVar26 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar26 == 0) &&
           (iVar26 = setup_traffic_protection(tls,1,"s ap traffic",3,0), iVar26 == 0)) &&
          (iVar26 = derive_secret(tls->key_schedule,&tls->field_20,"c ap traffic"), iVar26 == 0)) &&
         (iVar26 = derive_exporter_secret(tls,0), iVar26 == 0)) {
        ppVar30 = tls->ctx;
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
          if ((ppVar30->field_0x68 & 8) == 0) {
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          }
          else {
            tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
          }
        }
        else if ((ppVar30->field_0x68 & 0x10) == 0) {
          tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
        else {
          iVar26 = commission_handshake_secret(tls);
          if (iVar26 != 0) goto LAB_0011577b;
          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          ppVar30 = tls->ctx;
        }
        if ((local_518.psk.ke_modes != 0) && (ppVar30->ticket_lifetime != 0)) {
          iVar26 = send_session_ticket(tls,emitter);
          if (iVar26 != 0) goto LAB_0011577b;
          ppVar30 = tls->ctx;
        }
        iVar26 = 0x202;
        if ((ppVar30->field_0x68 & 8) == 0) {
          iVar26 = 0;
        }
      }
    }
    goto LAB_0011577b;
  }
  if (5 < (long)uVar39) {
    iVar26 = 0x28;
    if ((ushort)(*(ushort *)(puVar35 + 4) << 8 | *(ushort *)(puVar35 + 4) >> 8) != 0x303)
    goto LAB_0011577b;
    psVar1 = (st_ptls_aead_context_t *)(puVar35 + uVar39);
    puVar61 = puVar35 + 6;
    if (((0x25 < uVar39) && (eVar5 = tls->state, local_518.random_bytes = puVar61, uVar39 != 0x26))
       && (uVar41 = (ulong)puVar35[0x26], uVar41 <= uVar39 - 0x27 && uVar41 < 0x21)) {
      local_518.legacy_session_id.base = puVar35 + 0x27;
      local_518.legacy_session_id.len = uVar41;
      if (1 < (ulong)((long)psVar1 - (long)(puVar35 + uVar41 + 0x27))) {
        uVar4 = *(ushort *)(puVar35 + uVar41 + 0x27);
        uVar47 = (ulong)(ushort)(uVar4 << 8 | uVar4 >> 8);
        puVar61 = puVar35 + uVar41 + 0x29;
        if (uVar47 <= (ulong)((long)psVar1 - (long)puVar61)) {
          psVar62 = (st_ptls_aead_context_t *)(puVar61 + uVar47);
          uVar46 = 0x200;
          uVar40 = uVar47;
          sVar55 = 1;
          do {
            local_518.cipher_suites.base = puVar61;
            local_518.cipher_suites.len = uVar47;
            if ((long)uVar40 < 2) goto LAB_001156b1;
            lVar52 = uVar46 + uVar41;
            *(ushort *)((long)local_518.signature_algorithms.list + (uVar46 - 0x60)) =
                 *(ushort *)(puVar35 + lVar52 + -0x1d7) << 8 |
                 *(ushort *)(puVar35 + lVar52 + -0x1d7) >> 8;
            local_518.client_ciphers.count = sVar55;
            if (0x23d < uVar46) break;
            uVar46 = uVar46 + 2;
            uVar40 = uVar40 - 2;
            sVar55 = sVar55 + 1;
          } while ((st_ptls_aead_context_t *)(puVar35 + lVar52 + -0x1d5) != psVar62);
          if (psVar62 != psVar1) {
            puVar61 = (uint8_t *)((long)&psVar62->algo + 1);
            uVar41 = (ulong)*(byte *)&psVar62->algo;
            if (uVar41 <= (ulong)((long)psVar1 - (long)puVar61) && uVar41 != 0) {
              local_518.compression_methods.count =
                   (long)(psVar62->static_iv + (uVar41 - 7)) - (long)puVar61;
              local_5d8 = (st_ptls_aead_context_t *)0x0;
              local_518.compression_methods.ids = puVar61;
              if (1 < (ulong)((long)psVar1 - (long)(psVar62->static_iv + (uVar41 - 7)))) {
                uVar47 = (ulong)(ushort)(*(ushort *)(psVar62->static_iv + (uVar41 - 7)) << 8 |
                                        *(ushort *)(psVar62->static_iv + (uVar41 - 7)) >> 8);
                psVar62 = (st_ptls_aead_context_t *)(psVar62->static_iv + (uVar41 - 5));
                if (uVar47 <= (ulong)((long)psVar1 - (long)psVar62)) {
                  if (uVar47 != 0) {
                    psVar56 = (st_ptls_aead_context_t *)(psVar62->static_iv + (uVar47 - 8));
LAB_001158e2:
                    if ((long)psVar56 - (long)psVar62 < 2) goto LAB_001156b1;
                    uVar2 = *(uint8_t *)&psVar62->algo;
                    bVar3 = *(byte *)((long)&psVar62->algo + 1);
                    uVar4 = CONCAT11(uVar2,bVar3);
                    if (uVar4 < 0x40) {
                      if ((auStack_5d0[(ulong)(uVar4 >> 3) - 8] >> (uVar4 & 7) & 1) == 0) {
                        auStack_5d0[(ulong)(bVar3 >> 3) - 8] =
                             auStack_5d0[(ulong)(bVar3 >> 3) - 8] | '\x01' << (bVar3 & 7);
                        goto LAB_00115933;
                      }
LAB_0011637e:
                      iVar26 = 0x2f;
                      goto LAB_0011577b;
                    }
LAB_00115933:
                    if ((ulong)((long)psVar56 - (long)((long)&psVar62->algo + 2)) < 2)
                    goto LAB_001156b1;
                    uVar24 = *(ushort *)((long)&psVar62->algo + 2);
                    uVar24 = uVar24 << 8 | uVar24 >> 8;
                    uVar41 = (ulong)uVar24;
                    psVar28 = (st_ptls_aead_context_t *)((long)&psVar62->algo + 4);
                    local_5c8.server_name.base = (uint8_t *)psVar28;
                    if ((ulong)((long)psVar56 - (long)psVar28) < uVar41) goto LAB_001156b1;
                    psVar6 = tls->ctx->on_extension;
                    uVar21 = CONCAT11(uVar2,bVar3);
                    if (psVar6 != (st_ptls_on_extension_t *)0x0) {
                      pVar67.len._0_2_ = uVar24;
                      pVar67.base = (uint8_t *)psVar28;
                      pVar67.len._2_6_ = 0;
                      iVar25 = (*psVar6->cb)(psVar6,tls,'\x01',uVar21,pVar67);
                      iVar26 = 1;
                      if (iVar25 != 0) goto LAB_0011577b;
                    }
                    end = (st_ptls_aead_context_t *)(psVar28->static_iv + (uVar41 - 8));
                    psVar51 = (st_ptls_aead_context_t *)local_518.negotiated_groups.base;
                    sVar55 = local_518.negotiated_groups.len;
                    if (uVar21 < 0x1b) {
                      if (uVar21 < 10) {
                        if (uVar21 == 0) {
                          iVar26 = client_hello_decode_server_name
                                             (&local_518.server_name,(uint8_t **)&local_5c8,
                                              (uint8_t *)end);
                          psVar62 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
                          if (iVar26 == 0) goto joined_r0x00115d30;
                          goto LAB_0011577b;
                        }
                        if (uVar21 != 5) goto switchD_001159f2_caseD_2e;
                        local_518._1248_1_ = local_518._1248_1_ | 1;
                      }
                      else {
                        psVar51 = psVar28;
                        sVar55 = uVar41;
                        if (uVar21 == 10) goto LAB_00116222;
                        if (uVar21 != 0xd) {
                          if (uVar21 != 0x10) goto switchD_001159f2_caseD_2e;
                          if (1 < uVar24) {
                            uVar24 = *(ushort *)((long)&psVar62->algo + 4);
                            uVar41 = (ulong)(ushort)(uVar24 << 8 | uVar24 >> 8);
                            local_5c8.server_name.base = (uint8_t *)((long)&psVar62->algo + 6);
                            if (uVar41 <= (ulong)((long)end - (long)local_5c8.server_name.base)) {
                              psVar62 = (st_ptls_aead_context_t *)
                                        (((st_ptls_aead_context_t *)local_5c8.server_name.base)->
                                         static_iv + (uVar41 - 8));
                              sVar55 = local_518.alpn.count;
                              psVar28 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
                              do {
                                if (psVar62 == psVar28) goto LAB_001156b1;
                                puVar61 = (uint8_t *)((long)&psVar28->algo + 1);
                                uVar41 = (ulong)*(byte *)&psVar28->algo;
                                if (((ulong)((long)psVar62 - (long)puVar61) < uVar41) ||
                                   (uVar41 == 0)) goto LAB_001156b1;
                                psVar28 = (st_ptls_aead_context_t *)
                                          (psVar28->static_iv + (uVar41 - 7));
                                uVar41 = sVar55;
                                if (sVar55 < 0x10) {
                                  uVar41 = sVar55 + 1;
                                  local_518.alpn.list[sVar55].base = puVar61;
                                  local_518.alpn.count = uVar41;
                                  local_518.alpn.list[sVar55].len = (long)psVar28 - (long)puVar61;
                                }
                                sVar55 = uVar41;
                              } while (psVar28 != psVar62);
                              goto joined_r0x00115d30;
                            }
                          }
                          goto LAB_001156b1;
                        }
                        iVar26 = decode_signature_algorithms
                                           (&local_518.signature_algorithms,(uint8_t **)&local_5c8,
                                            (uint8_t *)end);
                        psVar51 = (st_ptls_aead_context_t *)local_518.negotiated_groups.base;
                        sVar55 = local_518.negotiated_groups.len;
                        if (iVar26 != 0) goto LAB_0011577b;
                      }
                    }
                    else {
                      switch(uVar21) {
                      case 0x29:
                        if (1 < uVar24) {
                          uVar24 = *(ushort *)((long)&psVar62->algo + 4);
                          uVar41 = (ulong)(ushort)(uVar24 << 8 | uVar24 >> 8);
                          local_5c8.server_name.base = (uint8_t *)((long)&psVar62->algo + 6);
                          if (uVar41 <= (ulong)((long)end - (long)local_5c8.server_name.base)) {
                            psVar28 = (st_ptls_aead_context_t *)
                                      (((st_ptls_aead_context_t *)local_5c8.server_name.base)->
                                       static_iv + (uVar41 - 8));
                            sVar55 = local_518.psk.identities.count;
                            lVar52 = 1;
                            psVar62 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
                            do {
                              lVar50 = lVar52;
                              if ((ulong)((long)psVar28 - (long)psVar62) < 2) goto LAB_001156b1;
                              uVar41 = (ulong)(ushort)(*(ushort *)&psVar62->algo << 8 |
                                                      *(ushort *)&psVar62->algo >> 8);
                              puVar61 = (uint8_t *)((long)&psVar62->algo + 2);
                              if (((ulong)((long)psVar28 - (long)puVar61) < uVar41) ||
                                 ((long)psVar28 - (long)(puVar61 + uVar41) < 4)) goto LAB_001156b1;
                              uVar47 = sVar55;
                              if (sVar55 < 4) {
                                uVar45 = *(uint *)(puVar61 + uVar41);
                                uVar47 = sVar55 + 1;
                                local_518.psk.identities.count = uVar47;
                                local_518.psk.identities.list[sVar55].identity.base = puVar61;
                                local_518.psk.identities.list[sVar55].identity.len = uVar41;
                                local_518.psk.identities.list[sVar55].obfuscated_ticket_age =
                                     uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 |
                                     (uVar45 & 0xff00) << 8 | uVar45 << 0x18;
                                *(undefined8 *)&local_518.psk.identities.list[sVar55].field_0x14 = 0
                                ;
                                *(undefined8 *)
                                 ((long)&local_518.psk.identities.list[sVar55].binder.base + 4) = 0;
                                *(undefined4 *)
                                 ((long)&local_518.psk.identities.list[sVar55].binder.len + 4) = 0;
                              }
                              psVar62 = (st_ptls_aead_context_t *)(puVar61 + uVar41 + 4);
                              sVar55 = uVar47;
                              lVar52 = lVar50 + 1;
                            } while (psVar62 != psVar28);
                            local_518.psk.hash_end = (uint8_t *)psVar28;
                            if (1 < (ulong)((long)end - (long)psVar28)) {
                              uVar41 = (ulong)(ushort)(*(ushort *)&psVar28->algo << 8 |
                                                      *(ushort *)&psVar28->algo >> 8);
                              local_5c8.server_name.base = (uint8_t *)((long)&psVar28->algo + 2);
                              if (uVar41 <= (ulong)((long)end - (long)local_5c8.server_name.base)) {
                                psVar62 = (st_ptls_aead_context_t *)
                                          (((st_ptls_aead_context_t *)local_5c8.server_name.base)->
                                           static_iv + (uVar41 - 8));
                                psVar58 = &local_518.psk.identities.list[0].binder.len;
                                uVar41 = 0;
                                psVar28 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
                                do {
                                  if (psVar62 == psVar28) goto LAB_001156b1;
                                  uVar40 = (ulong)*(byte *)&psVar28->algo;
                                  puVar61 = (uint8_t *)((long)&psVar28->algo + 1);
                                  if ((ulong)((long)psVar62 - (long)puVar61) < uVar40)
                                  goto LAB_001156b1;
                                  if (uVar41 < uVar47) {
                                    ((ptls_iovec_t *)(psVar58 + -1))->base = puVar61;
                                    *psVar58 = uVar40;
                                  }
                                  psVar28 = (st_ptls_aead_context_t *)(puVar61 + uVar40);
                                  uVar41 = uVar41 + 1;
                                  lVar50 = lVar50 + -1;
                                  psVar58 = psVar58 + 5;
                                } while (psVar28 != psVar62);
                                if (lVar50 != 0) goto LAB_0011637e;
                                goto joined_r0x00115d30;
                              }
                            }
                          }
                        }
                        goto LAB_001156b1;
                      case 0x2a:
                        local_518.psk.early_data_indication = 1;
                        break;
                      case 0x2b:
                        if (uVar41 != 0) {
                          local_5c8.server_name.base = (uint8_t *)((long)&psVar62->algo + 5);
                          bVar3 = *(byte *)((long)&psVar62->algo + 4);
                          if (((ulong)bVar3 <= (ulong)((long)end - (long)local_5c8.server_name.base)
                              ) && (1 < bVar3)) {
                            psVar62 = (st_ptls_aead_context_t *)
                                      (((st_ptls_aead_context_t *)local_5c8.server_name.base)->
                                       static_iv + ((ulong)bVar3 - 8));
                            psVar28 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
                            lVar52 = 4;
                            do {
                              psVar51 = (st_ptls_aead_context_t *)((long)&psVar28->algo + 2);
                              if (lVar52 == 0) {
                                if (psVar51 == psVar62) {
                                  lVar49 = 0;
                                  goto LAB_001161fc;
                                }
                                lVar49 = 0;
                              }
                              else {
                                puVar59 = supported_versions;
                                lVar50 = 0;
                                do {
                                  lVar49 = lVar50;
                                  if (*puVar59 ==
                                      (uint16_t)
                                      (*(ushort *)&psVar28->algo << 8 |
                                      *(ushort *)&psVar28->algo >> 8)) break;
                                  lVar50 = lVar50 + 1;
                                  puVar59 = puVar59 + 1;
                                  lVar49 = lVar52;
                                } while (lVar52 != lVar50);
                                if (psVar51 == psVar62) goto LAB_0011623d;
                              }
                              psVar28 = psVar51;
                              lVar52 = lVar49;
                              if ((long)psVar62 - (long)psVar51 < 2) break;
                            } while( true );
                          }
                        }
                        goto LAB_001156b1;
                      case 0x2c:
                        iVar26 = 0x2f;
                        if ((properties != (ptls_handshake_properties_t *)0x0) &&
                           ((properties->field_0).server.cookie.key != (void *)0x0)) {
                          local_518.cookie.all.base = (uint8_t *)psVar28;
                          local_518.cookie.all.len = uVar41;
                          if (1 < uVar41) {
                            uVar24 = *(ushort *)((long)&psVar62->algo + 4);
                            uVar41 = (ulong)(ushort)(uVar24 << 8 | uVar24 >> 8);
                            puVar61 = (uint8_t *)((long)&psVar62->algo + 6);
                            if ((uVar41 <= (ulong)((long)end - (long)puVar61)) &&
                               (local_518.cookie.tbs.base = puVar61, 1 < uVar41)) {
                              psVar28 = (st_ptls_aead_context_t *)(puVar61 + uVar41);
                              uVar24 = *(ushort *)((long)&psVar62->algo + 6);
                              uVar41 = (ulong)(ushort)(uVar24 << 8 | uVar24 >> 8);
                              if ((uVar41 <= (ulong)((long)psVar28 - (long)psVar62->static_iv)) &&
                                 (uVar41 != 0)) {
                                psVar51 = (st_ptls_aead_context_t *)(psVar62->static_iv + uVar41);
                                uVar41 = (ulong)psVar62->static_iv[0];
                                puVar60 = psVar62->static_iv + 1;
                                if ((uVar41 <= (ulong)((long)psVar51 - (long)puVar60)) &&
                                   (psVar62 = (st_ptls_aead_context_t *)(puVar60 + uVar41),
                                   local_518.cookie.ch1_hash.base = puVar60,
                                   local_518.cookie.ch1_hash.len = uVar41, psVar62 != psVar51)) {
                                  if (*(uint8_t *)&psVar62->algo == '\x01') {
                                    local_518.cookie._64_1_ = local_518.cookie._64_1_ | 1;
                                  }
                                  else {
                                    if (*(uint8_t *)&psVar62->algo != '\0') goto LAB_001156b1;
                                    if ((local_518.cookie._64_1_ & 1) != 0) {
                                      __assert_fail("!ch->cookie.sent_key_share",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                                                  ,0xcd7,
                                                  "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                                  );
                                    }
                                  }
                                  if (((st_ptls_aead_context_t *)((long)&psVar62->algo + 1) ==
                                       psVar51) &&
                                     (local_518.cookie.tbs.len = (long)psVar51 - (long)puVar61,
                                     psVar28 != psVar51)) {
                                    local_5c8.server_name.base =
                                         (uint8_t *)((long)&psVar62->algo + 2);
                                    uVar41 = (ulong)*(byte *)&psVar51->algo;
                                    if ((uVar41 <= (ulong)((long)psVar28 -
                                                          (long)local_5c8.server_name.base)) &&
                                       (local_518.cookie.signature.base = local_5c8.server_name.base
                                       , local_518.cookie.signature.len = uVar41,
                                       psVar62 = (st_ptls_aead_context_t *)
                                                 (((st_ptls_aead_context_t *)
                                                  local_5c8.server_name.base)->static_iv +
                                                 (uVar41 - 8)),
                                       (st_ptls_aead_context_t *)
                                       (((st_ptls_aead_context_t *)local_5c8.server_name.base)->
                                        static_iv + (uVar41 - 8)) == psVar28))
                                    goto joined_r0x00115d30;
                                  }
                                }
                              }
                            }
                          }
                          goto LAB_001156b1;
                        }
                        goto LAB_0011577b;
                      case 0x2d:
                        if (uVar41 != 0) {
                          local_5c8.server_name.base = (uint8_t *)((long)&psVar62->algo + 5);
                          uVar41 = (ulong)*(byte *)((long)&psVar62->algo + 4);
                          if ((uVar41 <= (ulong)((long)end - (long)local_5c8.server_name.base)) &&
                             (uVar41 != 0)) {
                            uVar45 = local_518.psk.ke_modes;
                            psVar62 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
                            if ((st_ptls_aead_context_t *)local_5c8.server_name.base !=
                                (st_ptls_aead_context_t *)(psVar28->static_iv + (uVar41 - 7))) {
                              do {
                                if (*(byte *)&((st_ptls_aead_context_t *)local_5c8.server_name.base)
                                              ->algo < 0x20) {
                                  uVar45 = uVar45 | 1 << (*(byte *)&((st_ptls_aead_context_t *)
                                                                    local_5c8.server_name.base)->
                                                                    algo & 0x1f);
                                  local_518.psk.ke_modes = uVar45;
                                }
                                local_5c8.server_name.base =
                                     (uint8_t *)
                                     ((long)&((st_ptls_aead_context_t *)local_5c8.server_name.base)
                                             ->algo + 1);
                                uVar41 = uVar41 - 1;
                                psVar62 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
                              } while (uVar41 != 0);
                            }
                            goto joined_r0x00115d30;
                          }
                        }
                        goto LAB_001156b1;
                      case 0x2e:
                      case 0x2f:
                      case 0x30:
                      case 0x31:
                      case 0x32:
switchD_001159f2_caseD_2e:
                        handle_unknown_extension
                                  (tls,properties,uVar21,(uint8_t *)psVar28,(uint8_t *)end,
                                   local_518.unknown_extensions);
                        psVar51 = (st_ptls_aead_context_t *)local_518.negotiated_groups.base;
                        sVar55 = local_518.negotiated_groups.len;
                        break;
                      case 0x33:
                        local_518.key_shares.base = (uint8_t *)psVar28;
                        local_518.key_shares.len = uVar41;
                        break;
                      default:
                        if (uVar21 == 0x1b) {
                          if (uVar41 != 0) {
                            local_5c8.server_name.base = (uint8_t *)((long)&psVar62->algo + 5);
                            uVar41 = (ulong)*(byte *)((long)&psVar62->algo + 4);
                            if (uVar41 <= (ulong)((long)end - (long)local_5c8.server_name.base)) {
                              lVar52 = uVar41 - 8;
                              puVar61 = (uint8_t *)((long)&psVar62->algo + 6);
                              sVar55 = local_518.cert_compression_algos.count;
                              do {
                                if ((long)uVar41 < 2) goto LAB_001156b1;
                                uVar47 = sVar55;
                                if (sVar55 < 0x10) {
                                  uVar47 = sVar55 + 1;
                                  local_518.cert_compression_algos.list[sVar55] =
                                       *(ushort *)(puVar61 + -1) << 8 |
                                       *(ushort *)(puVar61 + -1) >> 8;
                                  local_518.cert_compression_algos.count = uVar47;
                                }
                                puVar61 = puVar61 + 2;
                                uVar41 = uVar41 - 2;
                                sVar55 = uVar47;
                                psVar62 = (st_ptls_aead_context_t *)
                                          (((st_ptls_aead_context_t *)local_5c8.server_name.base)->
                                           static_iv + lVar52);
                              } while (uVar41 != 0);
                              goto joined_r0x00115d30;
                            }
                          }
                          goto LAB_001156b1;
                        }
                        if (uVar21 != 0xffce) goto switchD_001159f2_caseD_2e;
                        iVar25 = 0x2f;
                        iVar26 = iVar25;
                        if (local_518.esni.cipher != (ptls_cipher_suite_t *)0x0) goto LAB_0011577b;
                        if (uVar24 < 2) goto LAB_001156b1;
                        uVar24 = *(ushort *)((long)&psVar62->algo + 4);
                        local_5c8.server_name.base = (uint8_t *)((long)&psVar62->algo + 6);
                        pppVar57 = tls->ctx->cipher_suites;
                        ppVar48 = *pppVar57;
                        if (ppVar48 == (ptls_cipher_suite_t *)0x0) goto LAB_0011577b;
                        while (ppVar48->id != (uint16_t)(uVar24 << 8 | uVar24 >> 8)) {
                          ppVar48 = pppVar57[1];
                          pppVar57 = pppVar57 + 1;
                          if (ppVar48 == (ptls_cipher_suite_t *)0x0) goto LAB_0011577b;
                        }
                        iVar26 = select_key_share(&local_518.esni.key_share,&local_518.esni.peer_key
                                                  ,tls->ctx->key_exchanges,(uint8_t **)&local_5c8,
                                                  (uint8_t *)end,1);
                        if (iVar26 != 0) goto LAB_0011577b;
                        if ((ulong)((long)end - (long)local_5c8.server_name.base) < 2)
                        goto LAB_001156b1;
                        uVar41 = (ulong)(ushort)(*(ushort *)
                                                  (st_ptls_aead_algorithm_t **)
                                                  local_5c8.server_name.base << 8 |
                                                *(ushort *)
                                                 (st_ptls_aead_algorithm_t **)
                                                 local_5c8.server_name.base >> 8);
                        puVar61 = (uint8_t *)
                                  ((long)(st_ptls_aead_algorithm_t **)local_5c8.server_name.base + 2
                                  );
                        if ((ulong)((long)end - (long)puVar61) < uVar41) goto LAB_001156b1;
                        iVar26 = iVar25;
                        if (uVar41 != (*pppVar57)->hash->digest_size) goto LAB_0011577b;
                        puVar29 = (ushort *)(puVar61 + uVar41);
                        local_518.esni.record_digest = puVar61;
                        if ((ulong)((long)end - (long)puVar29) < 2) goto LAB_001156b1;
                        uVar41 = (ulong)(ushort)(*puVar29 << 8 | *puVar29 >> 8);
                        puVar29 = puVar29 + 1;
                        if ((ulong)((long)end - (long)puVar29) < uVar41) goto LAB_001156b1;
                        if ((uVar41 < (*pppVar57)->aead->tag_size) ||
                           (iVar26 = 0x32, local_518.esni.encrypted_sni.base = (uint8_t *)puVar29,
                           local_518.esni.encrypted_sni.len = uVar41,
                           (st_ptls_aead_context_t *)((long)puVar29 + uVar41) != end))
                        goto LAB_0011577b;
                        local_518.esni.cipher = *pppVar57;
                        psVar51 = (st_ptls_aead_context_t *)local_518.negotiated_groups.base;
                        sVar55 = local_518.negotiated_groups.len;
                      }
                    }
                    goto LAB_00116222;
                  }
                  bVar65 = false;
                  goto LAB_001162d7;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001156b1:
  iVar26 = 0x32;
  goto LAB_0011577b;
LAB_0011623d:
  local_5c8.server_name.base = (uint8_t *)psVar62;
  if (lVar49 != 4) {
LAB_001161fc:
    local_518.selected_version = supported_versions[lVar49];
    local_5c8.server_name.base = (uint8_t *)psVar62;
  }
joined_r0x00115d30:
  iVar26 = 0x32;
  psVar51 = (st_ptls_aead_context_t *)local_518.negotiated_groups.base;
  sVar55 = local_518.negotiated_groups.len;
  if (psVar62 != end) goto LAB_0011577b;
LAB_00116222:
  local_518.negotiated_groups.len = sVar55;
  local_518.negotiated_groups.base = (uint8_t *)psVar51;
  local_5c8.server_name.base = (uint8_t *)end;
  psVar62 = end;
  if (end == psVar56) goto LAB_0011636d;
  goto LAB_001158e2;
joined_r0x001164d8:
  iVar26 = iVar25;
  if (ppVar8 == (ptls_esni_context_t *)0x0) goto LAB_0011790c;
  ppVar42 = ppVar8->cipher_suites->cipher_suite;
  if (ppVar42 == (ptls_cipher_suite_t *)0x0) goto LAB_0011790c;
  paVar15 = ppVar8->cipher_suites;
  while (ppVar42->id != ppVar48->id) {
    ppVar42 = paVar15[1].cipher_suite;
    paVar15 = paVar15 + 1;
    if (ppVar42 == (ptls_cipher_suite_t *)0x0) goto LAB_0011790c;
  }
  hash = ppVar48->hash;
  iVar27 = bcmp(paVar15->record_digest,puVar60,hash->digest_size);
  if (iVar27 == 0) {
    local_618 = ppVar8->key_exchanges;
    ppVar44 = *local_618;
    if (ppVar44 != (ptls_key_exchange_context_t *)0x0) {
      goto LAB_00117858;
    }
    goto LAB_0011790c;
  }
  ppVar8 = pppVar33[1];
  pppVar33 = pppVar33 + 1;
  goto joined_r0x001164d8;
LAB_00117858:
  if (ppVar44->algo->id != (local_518.esni.key_share)->id) goto code_r0x00117860;
  pubkey_00.len = local_518.esni.peer_key.len;
  pubkey_00.base = local_518.esni.peer_key.base;
  iVar26 = build_esni_contents_hash
                     (hash,psVar32->esni_contents_hash,puVar60,(local_518.esni.key_share)->id,
                      pubkey_00,puVar61);
  if (((iVar26 == 0) &&
      (pVar66.len = local_518.esni.peer_key.len, pVar66.base = local_518.esni.peer_key.base,
      iVar26 = (*(*local_618)->on_exchange)(local_618,0,&(*esni)->secret,pVar66), iVar26 == 0)) &&
     (sVar31 = local_518.esni.encrypted_sni.len - ppVar48->aead->tag_size, iVar26 = iVar25,
     sVar31 == (ulong)(*pppVar33)->padded_length + 0x10)) {
    local_630 = (st_ptls_aead_context_t *)malloc(sVar31);
    if (local_630 == (st_ptls_aead_context_t *)0x0) {
      iVar26 = 0x201;
    }
    else {
      iVar26 = create_esni_aead(&local_5d8,0,ppVar48,(*esni)->secret,(*esni)->esni_contents_hash);
      sVar37 = local_518.esni.encrypted_sni.len;
      puVar60 = local_518.esni.encrypted_sni.base;
      sVar55 = local_518.key_shares.len;
      puVar61 = local_518.key_shares.base;
      ctx = local_5d8;
      if (iVar26 == 0) {
        sVar64 = local_5d8->algo->iv_size;
        if (sVar64 - 8 != 0) {
          memcpy(&local_5c8,local_5d8->static_iv,sVar64 - 8);
        }
        lVar52 = -0x40;
        do {
          auStack_5d0[sVar64] = ctx->static_iv[sVar64 - 8];
          sVar64 = sVar64 + 1;
          lVar52 = lVar52 + 8;
        } while (lVar52 != 0);
        sVar55 = (*ctx->do_decrypt)(ctx,local_630,puVar60,sVar37,&local_5c8,puVar61,sVar55);
        if (sVar55 == (ulong)(*pppVar33)->padded_length + 0x10) {
          ptls_aead_free(ctx);
          uVar4 = (*pppVar33)->padded_length;
          if ((ulong)uVar4 < 0x10) {
LAB_0011812f:
            iVar26 = 0x2f;
            goto LAB_00118188;
          }
          psVar32 = *esni;
          uVar16 = *(undefined8 *)local_630->static_iv;
          *(st_ptls_aead_algorithm_t **)psVar32->nonce = local_630->algo;
          *(undefined8 *)(psVar32->nonce + 8) = uVar16;
          local_520 = local_630->static_iv + 8;
          iVar26 = client_hello_decode_server_name
                             (&local_5c8.server_name,&local_520,
                              local_630->static_iv + ((ulong)uVar4 - 8));
          puVar61 = local_520;
          if (iVar26 != 0) goto LAB_00118188;
          for (; puVar61 != local_630->static_iv + ((ulong)uVar4 - 8); puVar61 = puVar61 + 1) {
            if (*puVar61 != '\0') goto LAB_0011812f;
          }
          local_618 = (st_ptls_key_exchange_context_t **)local_5c8.server_name.len;
          memmove(local_630,local_5c8.server_name.base,local_5c8.server_name.len);
          ppVar30 = tls->ctx;
          psVar12 = ppVar30->update_esni_key;
          local_628._0_1_ = '\x01';
          if (psVar12 != (st_ptls_update_esni_key_t *)0x0) {
            iVar26 = (*psVar12->cb)(psVar12,tls,tls->esni->secret,(local_518.esni.cipher)->hash,
                                    tls->esni->esni_contents_hash);
            if (iVar26 != 0) goto LAB_0011577b;
            ppVar30 = tls->ctx;
          }
          bVar65 = false;
LAB_001165cc:
          if (ppVar30->on_client_hello == (ptls_on_client_hello_t *)0x0) {
            iVar26 = 0;
          }
          else {
            local_5c8.server_name.base = (uint8_t *)local_630;
            local_5c8.server_name.len = (size_t)local_618;
            local_5c8.negotiated_protocols.list = local_518.alpn.list;
            local_5c8.negotiated_protocols.count = local_518.alpn.count;
            local_5c8.signature_algorithms.list = local_518.signature_algorithms.list;
            local_5c8.signature_algorithms.count = local_518.signature_algorithms.count;
            local_5c8.certificate_compression_algorithms.list =
                 local_518.cert_compression_algos.list;
            local_5c8.certificate_compression_algorithms.count =
                 local_518.cert_compression_algos.count;
            local_5c8.cipher_suites.list = local_518.client_ciphers.list;
            local_5c8.cipher_suites.count = local_518.client_ciphers.count;
            local_5c8._80_1_ = (local_5c8._80_1_ & 0xfe) + (char)local_628;
            iVar26 = (*ppVar30->on_client_hello->cb)(ppVar30->on_client_hello,tls,&local_5c8);
          }
          if (!bVar65) {
            free(local_630);
          }
          if (iVar26 != 0) goto LAB_0011577b;
LAB_00116677:
          iVar26 = select_cipher((ptls_cipher_suite_t **)&local_5c8,tls->ctx->cipher_suites,
                                 local_518.cipher_suites.base,
                                 local_518.cipher_suites.base + local_518.cipher_suites.len);
          if (iVar26 != 0) goto LAB_0011577b;
          if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
            iVar26 = 0x28;
            if ((st_ptls_aead_context_t *)tls->cipher_suite !=
                (st_ptls_aead_context_t *)local_5c8.server_name.base) goto LAB_0011577b;
          }
          else {
            tls->cipher_suite = (ptls_cipher_suite_t *)local_5c8.server_name.base;
            ppVar34 = key_schedule_new((ptls_cipher_suite_t *)local_5c8.server_name.base,
                                       (ptls_cipher_suite_t **)0x0,
                                       tls->ctx->hkdf_label_prefix__obsolete);
            tls->key_schedule = ppVar34;
          }
          if ((st_ptls_aead_context_t *)local_518.key_shares.base != (st_ptls_aead_context_t *)0x0
              && local_568 == (ptls_key_exchange_algorithm_t *)0x0) {
            lVar52 = local_518.key_shares.len - 8;
            puVar61 = (uint8_t *)((long)local_518.key_shares.base + 8);
            cVar22 = '\x03';
            psVar62 = (st_ptls_aead_context_t *)local_518.key_shares.base;
            if (local_518.key_shares.len < 2) {
LAB_00116757:
              iVar25 = 0x32;
            }
            else {
              uVar41 = (ulong)(ushort)(*(ushort *)
                                        (st_ptls_aead_algorithm_t **)local_518.key_shares.base << 8
                                      | *(ushort *)
                                         (st_ptls_aead_algorithm_t **)local_518.key_shares.base >> 8
                                      );
              psVar62 = (st_ptls_aead_context_t *)
                        ((long)(st_ptls_aead_algorithm_t **)local_518.key_shares.base + 2);
              local_5c8.server_name.base = (uint8_t *)psVar62;
              if (local_518.key_shares.len - 2 < uVar41) goto LAB_00116757;
              psVar56 = (st_ptls_aead_context_t *)
                        ((uint8_t *)((long)local_518.key_shares.base + 8) + (uVar41 - 6));
              iVar25 = select_key_share(&local_568,&pStack_560,tls->ctx->key_exchanges,
                                        (uint8_t **)&local_5c8,(uint8_t *)psVar56,0);
              psVar62 = (st_ptls_aead_context_t *)local_5c8.server_name.base;
              if (iVar25 == 0) {
                iVar25 = 0x32;
                if ((st_ptls_aead_context_t *)local_5c8.server_name.base == psVar56) {
                  iVar25 = 0;
                }
                cVar22 = ((st_ptls_aead_context_t *)local_5c8.server_name.base != psVar56) * '\x03';
              }
            }
            bVar65 = psVar62 != (st_ptls_aead_context_t *)(puVar61 + lVar52);
            iVar26 = 0x32;
            if (!bVar65) {
              iVar26 = iVar25;
            }
            cVar19 = bVar65 * '\x03';
            if (cVar22 != '\0') {
              iVar26 = iVar25;
              cVar19 = cVar22;
            }
            if (cVar19 == '\x03') goto LAB_0011577b;
            if (cVar19 != '\0') {
              return iVar26;
            }
          }
          ppVar23 = local_568;
          if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
LAB_00116794:
            bVar65 = false;
          }
          else {
            if (local_568 != (ptls_key_exchange_algorithm_t *)0x0 && local_518.cookie.all.len != 0)
            {
              sVar55 = (*tls->ctx->cipher_suites)->hash->digest_size;
              tbs.len = local_518.cookie.tbs.len;
              tbs.base = local_518.cookie.tbs.base;
              iVar26 = calc_cookie_signature(tls,properties,local_568,tbs,(uint8_t *)&local_5c8);
              if (((iVar26 != 0) || (iVar26 = 0x28, local_518.cookie.signature.len != sVar55)) ||
                 (iVar25 = (*ptls_mem_equal)(local_518.cookie.signature.base,&local_5c8,sVar55),
                 iVar25 == 0)) goto LAB_0011577b;
              key_schedule_update_ch1hash_prefix(tls->key_schedule);
              sVar55 = local_518.cookie.ch1_hash.len;
              puVar61 = local_518.cookie.ch1_hash.base;
              local_628 = tls->key_schedule;
              if (local_628->num_hashes != 0) {
                pppVar43 = &local_628->hashes[0].ctx;
                sVar37 = 0;
                do {
                  (*(*pppVar43)->update)(*pppVar43,puVar61,sVar55);
                  sVar37 = sVar37 + 1;
                  pppVar43 = pppVar43 + 2;
                } while (sVar37 != local_628->num_hashes);
                local_628 = tls->key_schedule;
              }
              key_schedule_extract(local_628,(ptls_iovec_t)ZEXT816(0));
              sVar55 = emitter->buf->off;
              iVar26 = (*emitter->begin_message)(emitter);
              if (iVar26 != 0) goto LAB_0011577b;
              ppVar9 = emitter->buf;
              ppVar34 = tls->key_schedule;
              sVar37 = ppVar9->off;
              iVar26 = ptls_buffer_reserve(ppVar9,1);
              if (iVar26 != 0) goto LAB_0011577b;
              ppVar9->base[ppVar9->off] = '\x02';
              ppVar9->off = ppVar9->off + 1;
              iVar26 = ptls_buffer_reserve(ppVar9,3);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = ppVar9->base;
              sVar64 = ppVar9->off;
              puVar61[sVar64 + 2] = '\0';
              puVar61 = puVar61 + sVar64;
              puVar61[0] = '\0';
              puVar61[1] = '\0';
              local_5f0 = ppVar9->off;
              sVar64 = local_5f0 + 3;
              ppVar9->off = sVar64;
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = ppVar10->base;
              sVar54 = ppVar10->off;
              (puVar61 + sVar54)[0] = '\x03';
              (puVar61 + sVar54)[1] = '\x03';
              ppVar10->off = ppVar10->off + 2;
              iVar26 = ptls_buffer_reserve(emitter->buf,0x20);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = emitter->buf->base;
              sVar54 = emitter->buf->off;
              puVar60 = puVar61 + sVar54 + 0x10;
              puVar60[0] = 0xc2;
              puVar60[1] = 0xa2;
              puVar60[2] = '\x11';
              puVar60[3] = '\x16';
              puVar60[4] = 'z';
              puVar60[5] = 0xbb;
              puVar60[6] = 0x8c;
              puVar60[7] = '^';
              puVar60[8] = '\a';
              puVar60[9] = 0x9e;
              puVar60[10] = '\t';
              puVar60[0xb] = 0xe2;
              puVar60[0xc] = 200;
              puVar60[0xd] = 0xa8;
              puVar60[0xe] = '3';
              puVar60[0xf] = 0x9c;
              puVar61 = puVar61 + sVar54;
              puVar61[0] = 0xcf;
              puVar61[1] = '!';
              puVar61[2] = 0xad;
              puVar61[3] = 't';
              puVar61[4] = 0xe5;
              puVar61[5] = 0x9a;
              puVar61[6] = 'a';
              puVar61[7] = '\x11';
              puVar61[8] = 0xbe;
              puVar61[9] = '\x1d';
              puVar61[10] = 0x8c;
              puVar61[0xb] = '\x02';
              puVar61[0xc] = '\x1e';
              puVar61[0xd] = 'e';
              puVar61[0xe] = 0xb8;
              puVar61[0xf] = 0x91;
              ppVar10 = emitter->buf;
              ppVar10->off = ppVar10->off + 0x20;
              iVar26 = ptls_buffer_reserve(ppVar10,1);
              if (iVar26 != 0) goto LAB_0011577b;
              ppVar10->base[ppVar10->off] = '\0';
              ppVar10->off = ppVar10->off + 1;
              sVar54 = emitter->buf->off;
              iVar26 = ptls_buffer__do_pushv
                                 (emitter->buf,local_518.legacy_session_id.base,
                                  local_518.legacy_session_id.len);
              if (iVar26 != 0) goto LAB_0011577b;
              emitter->buf->base[sVar54 - 1] = (char)(int)emitter->buf->off - (char)sVar54;
              uVar4 = tls->cipher_suite->id;
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              *(ushort *)(ppVar10->base + ppVar10->off) = uVar4 << 8 | uVar4 >> 8;
              ppVar10->off = ppVar10->off + 2;
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,1);
              if (iVar26 != 0) goto LAB_0011577b;
              ppVar10->base[ppVar10->off] = '\0';
              ppVar10->off = ppVar10->off + 1;
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = ppVar10->base;
              sVar54 = ppVar10->off;
              (puVar61 + sVar54)[0] = '\0';
              (puVar61 + sVar54)[1] = '\0';
              ppVar10->off = ppVar10->off + 2;
              ppVar10 = emitter->buf;
              sVar54 = ppVar10->off;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = ppVar10->base;
              sVar38 = ppVar10->off;
              (puVar61 + sVar38)[0] = '\0';
              (puVar61 + sVar38)[1] = '+';
              ppVar10->off = ppVar10->off + 2;
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              uVar21 = local_518.selected_version;
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = ppVar10->base;
              sVar38 = ppVar10->off;
              (puVar61 + sVar38)[0] = '\0';
              (puVar61 + sVar38)[1] = '\0';
              ppVar10->off = ppVar10->off + 2;
              ppVar10 = emitter->buf;
              sVar38 = ppVar10->off;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              *(uint16_t *)(ppVar10->base + ppVar10->off) = uVar21 << 8 | uVar21 >> 8;
              ppVar10->off = ppVar10->off + 2;
              lVar52 = emitter->buf->off - sVar38;
              emitter->buf->base[sVar38 - 2] = (uint8_t)((ulong)lVar52 >> 8);
              emitter->buf->base[sVar38 - 1] = (uint8_t)lVar52;
              if ((local_518.cookie._64_1_ & 1) != 0) {
                ppVar10 = emitter->buf;
                iVar26 = ptls_buffer_reserve(ppVar10,2);
                if (iVar26 != 0) goto LAB_0011577b;
                puVar61 = ppVar10->base;
                sVar38 = ppVar10->off;
                (puVar61 + sVar38)[0] = '\0';
                (puVar61 + sVar38)[1] = '3';
                ppVar10->off = ppVar10->off + 2;
                ppVar10 = emitter->buf;
                iVar26 = ptls_buffer_reserve(ppVar10,2);
                if (iVar26 != 0) goto LAB_0011577b;
                puVar61 = ppVar10->base;
                sVar38 = ppVar10->off;
                (puVar61 + sVar38)[0] = '\0';
                (puVar61 + sVar38)[1] = '\0';
                ppVar10->off = ppVar10->off + 2;
                ppVar10 = emitter->buf;
                sVar38 = ppVar10->off;
                uVar4 = ppVar23->id;
                iVar26 = ptls_buffer_reserve(ppVar10,2);
                if (iVar26 != 0) goto LAB_0011577b;
                *(ushort *)(ppVar10->base + ppVar10->off) = uVar4 << 8 | uVar4 >> 8;
                ppVar10->off = ppVar10->off + 2;
                lVar52 = emitter->buf->off - sVar38;
                emitter->buf->base[sVar38 - 2] = (uint8_t)((ulong)lVar52 >> 8);
                emitter->buf->base[sVar38 - 1] = (uint8_t)lVar52;
              }
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = ppVar10->base;
              sVar38 = ppVar10->off;
              (puVar61 + sVar38)[0] = '\0';
              (puVar61 + sVar38)[1] = ',';
              ppVar10->off = ppVar10->off + 2;
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar61 = ppVar10->base;
              sVar38 = ppVar10->off;
              (puVar61 + sVar38)[0] = '\0';
              (puVar61 + sVar38)[1] = '\0';
              ppVar10->off = ppVar10->off + 2;
              sVar38 = emitter->buf->off;
              iVar26 = ptls_buffer__do_pushv
                                 (emitter->buf,local_518.cookie.all.base,local_518.cookie.all.len);
              if (iVar26 != 0) goto LAB_0011577b;
              lVar52 = emitter->buf->off - sVar38;
              emitter->buf->base[sVar38 - 2] = (uint8_t)((ulong)lVar52 >> 8);
              emitter->buf->base[sVar38 - 1] = (uint8_t)lVar52;
              lVar52 = emitter->buf->off - sVar54;
              emitter->buf->base[sVar54 - 2] = (uint8_t)((ulong)lVar52 >> 8);
              emitter->buf->base[sVar54 - 1] = (uint8_t)lVar52;
              sVar54 = ppVar9->off;
              lVar52 = 0x10;
              do {
                ppVar9->base[local_5f0] = (uint8_t)(sVar54 - sVar64 >> ((byte)lVar52 & 0x3f));
                lVar52 = lVar52 + -8;
                local_5f0 = local_5f0 + 1;
              } while (lVar52 != -8);
              if ((ppVar34 != (ptls_key_schedule_t *)0x0) && (ppVar34->num_hashes != 0)) {
                puVar61 = ppVar9->base;
                sVar64 = ppVar9->off;
                pppVar43 = &ppVar34->hashes[0].ctx;
                sVar54 = 0;
                do {
                  (*(*pppVar43)->update)(*pppVar43,puVar61 + sVar37,sVar64 - sVar37);
                  sVar54 = sVar54 + 1;
                  pppVar43 = pppVar43 + 2;
                } while (sVar54 != ppVar34->num_hashes);
              }
              iVar26 = (*emitter->commit_message)(emitter);
              if (iVar26 != 0) goto LAB_0011577b;
              emitter->buf->off = sVar55;
              goto LAB_00116794;
            }
            if (local_568 == (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00116ebf:
              if ((st_ptls_aead_context_t *)local_518.negotiated_groups.base ==
                  (st_ptls_aead_context_t *)0x0) {
                iVar26 = 0x6d;
              }
              else {
                iVar26 = select_negotiated_group
                                   ((ptls_key_exchange_algorithm_t **)&local_5c8,
                                    tls->ctx->key_exchanges,local_518.negotiated_groups.base,
                                    (uint8_t *)((long)local_518.negotiated_groups.base + 8) +
                                    (local_518.negotiated_groups.len - 8));
                if (iVar26 == 0) {
                  local_628 = tls->key_schedule;
                  if (local_628->num_hashes != 0) {
                    pppVar43 = &local_628->hashes[0].ctx;
                    sVar55 = 0;
                    do {
                      (*(*pppVar43)->update)(*pppVar43,puVar35,uVar39);
                      sVar55 = sVar55 + 1;
                      pppVar43 = pppVar43 + 2;
                    } while (sVar55 != local_628->num_hashes);
                    local_628 = tls->key_schedule;
                  }
                  if (local_628->generation != 0) {
                    __assert_fail("tls->key_schedule->generation == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                                  ,0xe8a,
                                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  if ((properties == (ptls_handshake_properties_t *)0x0) ||
                     ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
                    key_schedule_transform_post_ch1hash(local_628);
                    key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                    iVar26 = (*emitter->begin_message)(emitter);
                    if (iVar26 == 0) {
                      ppVar9 = emitter->buf;
                      ppVar34 = tls->key_schedule;
                      sVar55 = ppVar9->off;
                      iVar26 = ptls_buffer_reserve(ppVar9,1);
                      if (iVar26 == 0) {
                        ppVar9->base[ppVar9->off] = '\x02';
                        ppVar9->off = ppVar9->off + 1;
                        iVar26 = ptls_buffer_reserve(ppVar9,3);
                        if (iVar26 == 0) {
                          puVar35 = ppVar9->base;
                          sVar37 = ppVar9->off;
                          puVar35[sVar37 + 2] = '\0';
                          puVar35 = puVar35 + sVar37;
                          puVar35[0] = '\0';
                          puVar35[1] = '\0';
                          local_628 = (ptls_key_schedule_t *)ppVar9->off;
                          sVar37 = (long)local_628 + 3;
                          ppVar9->off = sVar37;
                          ppVar10 = emitter->buf;
                          iVar26 = ptls_buffer_reserve(ppVar10,2);
                          if (iVar26 == 0) {
                            puVar35 = ppVar10->base;
                            sVar64 = ppVar10->off;
                            (puVar35 + sVar64)[0] = '\x03';
                            (puVar35 + sVar64)[1] = '\x03';
                            ppVar10->off = ppVar10->off + 2;
                            iVar26 = ptls_buffer_reserve(emitter->buf,0x20);
                            if (iVar26 == 0) {
                              puVar35 = emitter->buf->base;
                              sVar64 = emitter->buf->off;
                              puVar61 = puVar35 + sVar64 + 0x10;
                              puVar61[0] = 0xc2;
                              puVar61[1] = 0xa2;
                              puVar61[2] = '\x11';
                              puVar61[3] = '\x16';
                              puVar61[4] = 'z';
                              puVar61[5] = 0xbb;
                              puVar61[6] = 0x8c;
                              puVar61[7] = '^';
                              puVar61[8] = '\a';
                              puVar61[9] = 0x9e;
                              puVar61[10] = '\t';
                              puVar61[0xb] = 0xe2;
                              puVar61[0xc] = 200;
                              puVar61[0xd] = 0xa8;
                              puVar61[0xe] = '3';
                              puVar61[0xf] = 0x9c;
                              puVar35 = puVar35 + sVar64;
                              puVar35[0] = 0xcf;
                              puVar35[1] = '!';
                              puVar35[2] = 0xad;
                              puVar35[3] = 't';
                              puVar35[4] = 0xe5;
                              puVar35[5] = 0x9a;
                              puVar35[6] = 'a';
                              puVar35[7] = '\x11';
                              puVar35[8] = 0xbe;
                              puVar35[9] = '\x1d';
                              puVar35[10] = 0x8c;
                              puVar35[0xb] = '\x02';
                              puVar35[0xc] = '\x1e';
                              puVar35[0xd] = 'e';
                              puVar35[0xe] = 0xb8;
                              puVar35[0xf] = 0x91;
                              ppVar10 = emitter->buf;
                              ppVar10->off = ppVar10->off + 0x20;
                              iVar26 = ptls_buffer_reserve(ppVar10,1);
                              if (iVar26 == 0) {
                                ppVar10->base[ppVar10->off] = '\0';
                                ppVar10->off = ppVar10->off + 1;
                                sVar64 = emitter->buf->off;
                                iVar26 = ptls_buffer__do_pushv
                                                   (emitter->buf,local_518.legacy_session_id.base,
                                                    local_518.legacy_session_id.len);
                                if (iVar26 == 0) {
                                  emitter->buf->base[sVar64 - 1] =
                                       (char)(int)emitter->buf->off - (char)sVar64;
                                  uVar4 = tls->cipher_suite->id;
                                  ppVar10 = emitter->buf;
                                  iVar26 = ptls_buffer_reserve(ppVar10,2);
                                  if (iVar26 == 0) {
                                    *(ushort *)(ppVar10->base + ppVar10->off) =
                                         uVar4 << 8 | uVar4 >> 8;
                                    ppVar10->off = ppVar10->off + 2;
                                    ppVar10 = emitter->buf;
                                    iVar26 = ptls_buffer_reserve(ppVar10,1);
                                    if (iVar26 == 0) {
                                      ppVar10->base[ppVar10->off] = '\0';
                                      ppVar10->off = ppVar10->off + 1;
                                      ppVar10 = emitter->buf;
                                      iVar26 = ptls_buffer_reserve(ppVar10,2);
                                      if (iVar26 == 0) {
                                        puVar35 = ppVar10->base;
                                        sVar64 = ppVar10->off;
                                        (puVar35 + sVar64)[0] = '\0';
                                        (puVar35 + sVar64)[1] = '\0';
                                        ppVar10->off = ppVar10->off + 2;
                                        ppVar10 = emitter->buf;
                                        sVar64 = ppVar10->off;
                                        iVar26 = ptls_buffer_reserve(ppVar10,2);
                                        if (iVar26 == 0) {
                                          puVar35 = ppVar10->base;
                                          sVar54 = ppVar10->off;
                                          (puVar35 + sVar54)[0] = '\0';
                                          (puVar35 + sVar54)[1] = '+';
                                          ppVar10->off = ppVar10->off + 2;
                                          ppVar10 = emitter->buf;
                                          iVar26 = ptls_buffer_reserve(ppVar10,2);
                                          uVar21 = local_518.selected_version;
                                          if (iVar26 == 0) {
                                            puVar35 = ppVar10->base;
                                            sVar54 = ppVar10->off;
                                            (puVar35 + sVar54)[0] = '\0';
                                            (puVar35 + sVar54)[1] = '\0';
                                            ppVar10->off = ppVar10->off + 2;
                                            ppVar10 = emitter->buf;
                                            sVar54 = ppVar10->off;
                                            iVar26 = ptls_buffer_reserve(ppVar10,2);
                                            puVar35 = local_5c8.server_name.base;
                                            if (iVar26 == 0) {
                                              *(uint16_t *)(ppVar10->base + ppVar10->off) =
                                                   uVar21 << 8 | uVar21 >> 8;
                                              ppVar10->off = ppVar10->off + 2;
                                              lVar52 = emitter->buf->off - sVar54;
                                              emitter->buf->base[sVar54 - 2] =
                                                   (uint8_t)((ulong)lVar52 >> 8);
                                              emitter->buf->base[sVar54 - 1] = (uint8_t)lVar52;
                                              if ((st_ptls_aead_context_t *)
                                                  local_5c8.server_name.base !=
                                                  (st_ptls_aead_context_t *)0x0 &&
                                                  ppVar23 == (ptls_key_exchange_algorithm_t *)0x0) {
                                                ppVar10 = emitter->buf;
                                                iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                if (iVar26 != 0) goto LAB_0011577b;
                                                puVar61 = ppVar10->base;
                                                sVar54 = ppVar10->off;
                                                (puVar61 + sVar54)[0] = '\0';
                                                (puVar61 + sVar54)[1] = '3';
                                                ppVar10->off = ppVar10->off + 2;
                                                ppVar10 = emitter->buf;
                                                iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                if (iVar26 != 0) goto LAB_0011577b;
                                                puVar61 = ppVar10->base;
                                                sVar54 = ppVar10->off;
                                                (puVar61 + sVar54)[0] = '\0';
                                                (puVar61 + sVar54)[1] = '\0';
                                                ppVar10->off = ppVar10->off + 2;
                                                ppVar10 = emitter->buf;
                                                sVar54 = ppVar10->off;
                                                uVar4 = *(ushort *)
                                                         (st_ptls_aead_algorithm_t **)puVar35;
                                                iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                if (iVar26 != 0) goto LAB_0011577b;
                                                *(ushort *)(ppVar10->base + ppVar10->off) =
                                                     uVar4 << 8 | uVar4 >> 8;
                                                ppVar10->off = ppVar10->off + 2;
                                                lVar52 = emitter->buf->off - sVar54;
                                                emitter->buf->base[sVar54 - 2] =
                                                     (uint8_t)((ulong)lVar52 >> 8);
                                                emitter->buf->base[sVar54 - 1] = (uint8_t)lVar52;
                                              }
                                              lVar52 = emitter->buf->off - sVar64;
                                              emitter->buf->base[sVar64 - 2] =
                                                   (uint8_t)((ulong)lVar52 >> 8);
                                              emitter->buf->base[sVar64 - 1] = (uint8_t)lVar52;
                                              sVar64 = ppVar9->off;
                                              lVar52 = 0x10;
                                              do {
                                                ppVar9->base[(long)local_628] =
                                                     (uint8_t)(sVar64 - sVar37 >>
                                                              ((byte)lVar52 & 0x3f));
                                                lVar52 = lVar52 + -8;
                                                local_628 = (ptls_key_schedule_t *)
                                                            ((long)local_628 + 1);
                                              } while (lVar52 != -8);
                                              if ((ppVar34 != (ptls_key_schedule_t *)0x0) &&
                                                 (ppVar34->num_hashes != 0)) {
                                                puVar35 = ppVar9->base;
                                                sVar37 = ppVar9->off;
                                                pppVar43 = &ppVar34->hashes[0].ctx;
                                                sVar64 = 0;
                                                do {
                                                  (*(*pppVar43)->update)
                                                            (*pppVar43,puVar35 + sVar55,
                                                             sVar37 - sVar55);
                                                  sVar64 = sVar64 + 1;
                                                  pppVar43 = pppVar43 + 2;
                                                } while (sVar64 != ppVar34->num_hashes);
                                              }
                                              iVar26 = (*emitter->commit_message)(emitter);
                                              if ((iVar26 == 0) &&
                                                 (iVar26 = push_change_cipher_spec(tls,emitter->buf)
                                                 , iVar26 == 0)) {
                                                tls->state = 
                                                PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                                iVar26 = 0x202;
                                                if (local_518.psk.early_data_indication != 0) {
                                                  (tls->field_20).server.early_data_skipped_bytes =
                                                       0;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    iVar26 = (*emitter->begin_message)(emitter);
                    if (iVar26 == 0) {
                      ppVar9 = emitter->buf;
                      iVar26 = ptls_buffer_reserve(ppVar9,1);
                      if (iVar26 == 0) {
                        ppVar9->base[ppVar9->off] = '\x02';
                        ppVar9->off = ppVar9->off + 1;
                        iVar26 = ptls_buffer_reserve(ppVar9,3);
                        if (iVar26 == 0) {
                          puVar35 = ppVar9->base;
                          sVar55 = ppVar9->off;
                          puVar35[sVar55 + 2] = '\0';
                          puVar35 = puVar35 + sVar55;
                          puVar35[0] = '\0';
                          puVar35[1] = '\0';
                          local_638 = ppVar9->off;
                          sVar55 = local_638 + 3;
                          ppVar9->off = sVar55;
                          ppVar10 = emitter->buf;
                          iVar26 = ptls_buffer_reserve(ppVar10,2);
                          if (iVar26 == 0) {
                            puVar35 = ppVar10->base;
                            sVar37 = ppVar10->off;
                            (puVar35 + sVar37)[0] = '\x03';
                            (puVar35 + sVar37)[1] = '\x03';
                            ppVar10->off = ppVar10->off + 2;
                            iVar26 = ptls_buffer_reserve(emitter->buf,0x20);
                            if (iVar26 == 0) {
                              puVar35 = emitter->buf->base;
                              sVar37 = emitter->buf->off;
                              puVar61 = puVar35 + sVar37 + 0x10;
                              puVar61[0] = 0xc2;
                              puVar61[1] = 0xa2;
                              puVar61[2] = '\x11';
                              puVar61[3] = '\x16';
                              puVar61[4] = 'z';
                              puVar61[5] = 0xbb;
                              puVar61[6] = 0x8c;
                              puVar61[7] = '^';
                              puVar61[8] = '\a';
                              puVar61[9] = 0x9e;
                              puVar61[10] = '\t';
                              puVar61[0xb] = 0xe2;
                              puVar61[0xc] = 200;
                              puVar61[0xd] = 0xa8;
                              puVar61[0xe] = '3';
                              puVar61[0xf] = 0x9c;
                              puVar35 = puVar35 + sVar37;
                              puVar35[0] = 0xcf;
                              puVar35[1] = '!';
                              puVar35[2] = 0xad;
                              puVar35[3] = 't';
                              puVar35[4] = 0xe5;
                              puVar35[5] = 0x9a;
                              puVar35[6] = 'a';
                              puVar35[7] = '\x11';
                              puVar35[8] = 0xbe;
                              puVar35[9] = '\x1d';
                              puVar35[10] = 0x8c;
                              puVar35[0xb] = '\x02';
                              puVar35[0xc] = '\x1e';
                              puVar35[0xd] = 'e';
                              puVar35[0xe] = 0xb8;
                              puVar35[0xf] = 0x91;
                              ppVar10 = emitter->buf;
                              ppVar10->off = ppVar10->off + 0x20;
                              iVar26 = ptls_buffer_reserve(ppVar10,1);
                              if (iVar26 == 0) {
                                ppVar10->base[ppVar10->off] = '\0';
                                ppVar10->off = ppVar10->off + 1;
                                sVar37 = emitter->buf->off;
                                iVar26 = ptls_buffer__do_pushv
                                                   (emitter->buf,local_518.legacy_session_id.base,
                                                    local_518.legacy_session_id.len);
                                if (iVar26 == 0) {
                                  emitter->buf->base[sVar37 - 1] =
                                       (char)(int)emitter->buf->off - (char)sVar37;
                                  uVar4 = tls->cipher_suite->id;
                                  ppVar10 = emitter->buf;
                                  iVar26 = ptls_buffer_reserve(ppVar10,2);
                                  if (iVar26 == 0) {
                                    *(ushort *)(ppVar10->base + ppVar10->off) =
                                         uVar4 << 8 | uVar4 >> 8;
                                    ppVar10->off = ppVar10->off + 2;
                                    ppVar10 = emitter->buf;
                                    iVar26 = ptls_buffer_reserve(ppVar10,1);
                                    if (iVar26 == 0) {
                                      ppVar10->base[ppVar10->off] = '\0';
                                      ppVar10->off = ppVar10->off + 1;
                                      ppVar10 = emitter->buf;
                                      iVar26 = ptls_buffer_reserve(ppVar10,2);
                                      if (iVar26 == 0) {
                                        puVar35 = ppVar10->base;
                                        sVar37 = ppVar10->off;
                                        (puVar35 + sVar37)[0] = '\0';
                                        (puVar35 + sVar37)[1] = '\0';
                                        ppVar10->off = ppVar10->off + 2;
                                        ppVar10 = emitter->buf;
                                        sVar37 = ppVar10->off;
                                        iVar26 = ptls_buffer_reserve(ppVar10,2);
                                        if (iVar26 == 0) {
                                          puVar35 = ppVar10->base;
                                          sVar64 = ppVar10->off;
                                          (puVar35 + sVar64)[0] = '\0';
                                          (puVar35 + sVar64)[1] = '+';
                                          ppVar10->off = ppVar10->off + 2;
                                          ppVar10 = emitter->buf;
                                          iVar26 = ptls_buffer_reserve(ppVar10,2);
                                          uVar21 = local_518.selected_version;
                                          if (iVar26 == 0) {
                                            puVar35 = ppVar10->base;
                                            sVar64 = ppVar10->off;
                                            (puVar35 + sVar64)[0] = '\0';
                                            (puVar35 + sVar64)[1] = '\0';
                                            ppVar10->off = ppVar10->off + 2;
                                            ppVar10 = emitter->buf;
                                            sVar64 = ppVar10->off;
                                            iVar26 = ptls_buffer_reserve(ppVar10,2);
                                            puVar35 = local_5c8.server_name.base;
                                            if (iVar26 == 0) {
                                              *(uint16_t *)(ppVar10->base + ppVar10->off) =
                                                   uVar21 << 8 | uVar21 >> 8;
                                              ppVar10->off = ppVar10->off + 2;
                                              lVar52 = emitter->buf->off - sVar64;
                                              emitter->buf->base[sVar64 - 2] =
                                                   (uint8_t)((ulong)lVar52 >> 8);
                                              emitter->buf->base[sVar64 - 1] = (uint8_t)lVar52;
                                              if ((st_ptls_aead_context_t *)
                                                  local_5c8.server_name.base !=
                                                  (st_ptls_aead_context_t *)0x0 &&
                                                  ppVar23 == (ptls_key_exchange_algorithm_t *)0x0) {
                                                ppVar10 = emitter->buf;
                                                iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                if (iVar26 != 0) goto LAB_0011577b;
                                                puVar61 = ppVar10->base;
                                                sVar64 = ppVar10->off;
                                                (puVar61 + sVar64)[0] = '\0';
                                                (puVar61 + sVar64)[1] = '3';
                                                ppVar10->off = ppVar10->off + 2;
                                                ppVar10 = emitter->buf;
                                                iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                if (iVar26 != 0) goto LAB_0011577b;
                                                puVar61 = ppVar10->base;
                                                sVar64 = ppVar10->off;
                                                (puVar61 + sVar64)[0] = '\0';
                                                (puVar61 + sVar64)[1] = '\0';
                                                ppVar10->off = ppVar10->off + 2;
                                                ppVar10 = emitter->buf;
                                                sVar64 = ppVar10->off;
                                                uVar4 = *(ushort *)
                                                         (st_ptls_aead_algorithm_t **)puVar35;
                                                iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                if (iVar26 != 0) goto LAB_0011577b;
                                                *(ushort *)(ppVar10->base + ppVar10->off) =
                                                     uVar4 << 8 | uVar4 >> 8;
                                                ppVar10->off = ppVar10->off + 2;
                                                lVar52 = emitter->buf->off - sVar64;
                                                emitter->buf->base[sVar64 - 2] =
                                                     (uint8_t)((ulong)lVar52 >> 8);
                                                emitter->buf->base[sVar64 - 1] = (uint8_t)lVar52;
                                              }
                                              ppVar10 = emitter->buf;
                                              iVar26 = ptls_buffer_reserve(ppVar10,2);
                                              if (iVar26 == 0) {
                                                puVar61 = ppVar10->base;
                                                sVar64 = ppVar10->off;
                                                (puVar61 + sVar64)[0] = '\0';
                                                (puVar61 + sVar64)[1] = ',';
                                                ppVar10->off = ppVar10->off + 2;
                                                iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                if (iVar26 == 0) {
                                                  puVar61 = ppVar10->base;
                                                  sVar64 = ppVar10->off;
                                                  (puVar61 + sVar64)[0] = '\0';
                                                  (puVar61 + sVar64)[1] = '\0';
                                                  sVar64 = ppVar10->off;
                                                  ppVar10->off = sVar64 + 2;
                                                  iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                  if (iVar26 == 0) {
                                                    puVar61 = ppVar10->base;
                                                    sVar54 = ppVar10->off;
                                                    (puVar61 + sVar54)[0] = '\0';
                                                    (puVar61 + sVar54)[1] = '\0';
                                                    sVar54 = ppVar10->off;
                                                    sVar38 = sVar54 + 2;
                                                    ppVar10->off = sVar38;
                                                    iVar26 = ptls_buffer_reserve(ppVar10,2);
                                                    if (iVar26 == 0) {
                                                      puVar61 = ppVar10->base;
                                                      sVar14 = ppVar10->off;
                                                      (puVar61 + sVar14)[0] = '\0';
                                                      (puVar61 + sVar14)[1] = '\0';
                                                      sVar14 = ppVar10->off;
                                                      ppVar10->off = sVar14 + 2;
                                                      iVar26 = ptls_buffer_reserve(ppVar10,1);
                                                      if (iVar26 == 0) {
                                                        ppVar10->base[ppVar10->off] = '\0';
                                                        sVar63 = ppVar10->off;
                                                        sVar36 = sVar63 + 1;
                                                        ppVar10->off = sVar36;
                                                        local_528 = tls->cipher_suite->hash->
                                                                    digest_size;
                                                        iVar26 = ptls_buffer_reserve(ppVar10,
                                                  local_528);
                                                  if (iVar26 == 0) {
                                                    psVar11 = tls->key_schedule->hashes[0].ctx;
                                                    (*psVar11->final)(psVar11,ppVar10->base +
                                                                              ppVar10->off,
                                                                      PTLS_HASH_FINAL_MODE_RESET);
                                                    sVar53 = local_528 + ppVar10->off;
                                                    ppVar10->off = sVar53;
                                                    ppVar10->base[sVar63] =
                                                         (char)sVar53 - (char)sVar36;
                                                    iVar26 = ptls_buffer_reserve(ppVar10,1);
                                                    if (iVar26 == 0) {
                                                      ppVar10->base[ppVar10->off] =
                                                           ppVar23 ==
                                                           (ptls_key_exchange_algorithm_t *)0x0;
                                                      sVar63 = ppVar10->off + 1;
                                                      ppVar10->off = sVar63;
                                                      lVar52 = sVar63 - (sVar14 + 2);
                                                      ppVar10->base[sVar14] =
                                                           (uint8_t)((ulong)lVar52 >> 8);
                                                      ppVar10->base[sVar14 + 1] = (uint8_t)lVar52;
                                                      sVar14 = ppVar10->off;
                                                      iVar26 = ptls_buffer_reserve(ppVar10,1);
                                                      if (iVar26 == 0) {
                                                        ppVar10->base[ppVar10->off] = '\0';
                                                        sVar63 = ppVar10->off;
                                                        sVar53 = sVar63 + 1;
                                                        ppVar10->off = sVar53;
                                                        sVar36 = (*tls->ctx->cipher_suites)->hash->
                                                                 digest_size;
                                                        iVar26 = ptls_buffer_reserve(ppVar10,sVar36)
                                                        ;
                                                        if ((iVar26 == 0) &&
                                                           (tbs_00.len = sVar14 - sVar38,
                                                           tbs_00.base = ppVar10->base + sVar38,
                                                           iVar26 = calc_cookie_signature
                                                                              (tls,properties,
                                                                               (
                                                  ptls_key_exchange_algorithm_t *)puVar35,tbs_00,
                                                  ppVar10->base + ppVar10->off), iVar26 == 0)) {
                                                    sVar36 = sVar36 + ppVar10->off;
                                                    ppVar10->off = sVar36;
                                                    ppVar10->base[sVar63] =
                                                         (char)sVar36 - (char)sVar53;
                                                    lVar52 = ppVar10->off - sVar38;
                                                    ppVar10->base[sVar54] =
                                                         (uint8_t)((ulong)lVar52 >> 8);
                                                    ppVar10->base[sVar54 + 1] = (uint8_t)lVar52;
                                                    lVar52 = ppVar10->off - (sVar64 + 2);
                                                    ppVar10->base[sVar64] =
                                                         (uint8_t)((ulong)lVar52 >> 8);
                                                    ppVar10->base[sVar64 + 1] = (uint8_t)lVar52;
                                                    lVar52 = emitter->buf->off - sVar37;
                                                    emitter->buf->base[sVar37 - 2] =
                                                         (uint8_t)((ulong)lVar52 >> 8);
                                                    emitter->buf->base[sVar37 - 1] = (uint8_t)lVar52
                                                    ;
                                                    sVar37 = ppVar9->off;
                                                    lVar52 = 0x10;
                                                    do {
                                                      ppVar9->base[local_638] =
                                                           (uint8_t)(sVar37 - sVar55 >>
                                                                    ((byte)lVar52 & 0x3f));
                                                      lVar52 = lVar52 + -8;
                                                      local_638 = local_638 + 1;
                                                    } while (lVar52 != -8);
                                                    iVar26 = (*emitter->commit_message)(emitter);
                                                    if (iVar26 == 0) {
                                                      iVar25 = push_change_cipher_spec
                                                                         (tls,emitter->buf);
                                                      iVar26 = 0x206;
                                                      if (iVar25 != 0) {
                                                        iVar26 = iVar25;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0011577b;
            }
            bVar65 = true;
            if ((properties != (ptls_handshake_properties_t *)0x0) &&
               (bVar65 = true, (*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0))
            goto LAB_00116ebf;
          }
          iVar26 = report_unknown_extensions(tls,properties,local_518.unknown_extensions);
          if ((iVar26 != 0) ||
             ((((bool)((st_ptls_aead_context_t *)local_518.psk.hash_end !=
                       (st_ptls_aead_context_t *)0x0 & bVar65) &&
               ((local_518.psk.ke_modes & 3) != 0)) &&
              ((tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0 &&
               (((tls->ctx->field_0x68 & 8) == 0 &&
                (ch_trunc.len = (long)local_518.psk.hash_end - (long)puVar35,
                ch_trunc.base = puVar35,
                iVar26 = try_psk_handshake(tls,&local_550,&local_5cc,&local_518,ch_trunc),
                iVar26 != 0)))))))) goto LAB_0011577b;
          puVar61 = local_518.psk.hash_end;
          sVar55 = local_550;
          if ((local_550 == 0xffffffffffffffff) || ((tls->ctx->field_0x68 & 8) != 0)) {
            ppVar34 = tls->key_schedule;
            if (ppVar34->num_hashes != 0) {
              pppVar43 = &ppVar34->hashes[0].ctx;
              sVar37 = 0;
              do {
                (*(*pppVar43)->update)(*pppVar43,puVar35,uVar39);
                sVar37 = sVar37 + 1;
                pppVar43 = pppVar43 + 2;
              } while (sVar37 != ppVar34->num_hashes);
            }
            if (bVar65) {
              if (tls->key_schedule->generation != 0) {
                __assert_fail("tls->key_schedule->generation == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                              ,0xed9,
                              "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                             );
              }
              key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
            }
            local_638._0_4_ = 0;
            if (properties != (ptls_handshake_properties_t *)0x0) {
              sVar31 = 0;
              local_638._0_4_ = 0;
              goto LAB_0011740c;
            }
          }
          else {
            ppVar34 = tls->key_schedule;
            if (ppVar34->num_hashes != 0) {
              sVar37 = (long)psVar1 - (long)local_518.psk.hash_end;
              pppVar43 = &ppVar34->hashes[0].ctx;
              sVar64 = 0;
              do {
                (*(*pppVar43)->update)(*pppVar43,puVar61,sVar37);
                sVar64 = sVar64 + 1;
                pppVar43 = pppVar43 + 2;
              } while (sVar64 != ppVar34->num_hashes);
            }
            local_638._0_4_ = 1;
            if (((local_518.psk.ke_modes & 1) == 0) &&
               (local_638._0_4_ = 2, (local_518.psk.ke_modes & 2) == 0)) {
              __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                            ,0xee4,
                            "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                           );
            }
            tls->field_0x160 = tls->field_0x160 | 2;
            if (properties != (ptls_handshake_properties_t *)0x0) {
              sVar31 = local_518.psk.identities.list[sVar55].binder.len;
              memcpy(properties,local_518.psk.identities.list[sVar55].binder.base,sVar31);
LAB_0011740c:
              *(size_t *)((long)&properties->field_0 + 0x40) = sVar31;
            }
          }
          if (((local_5cc != 0) && (sVar55 == 0)) && (tls->ctx->max_early_data_size != 0)) {
            puVar35 = (uint8_t *)malloc(0x40);
            tls->pending_handshake_secret = puVar35;
            if (puVar35 == (uint8_t *)0x0) {
LAB_001177dd:
              iVar26 = 0x201;
              goto LAB_0011577b;
            }
            iVar26 = derive_exporter_secret(tls,1);
            if ((iVar26 != 0) ||
               (iVar26 = setup_traffic_protection(tls,0,"c e traffic",1,0), iVar26 != 0))
            goto LAB_0011577b;
          }
          ppVar23 = local_568;
          if ((int)local_638 != 1) {
            if (local_568 == (st_ptls_key_exchange_algorithm_t *)0x0) {
              iVar26 = 0x28;
              if ((st_ptls_aead_context_t *)local_518.key_shares.base ==
                  (st_ptls_aead_context_t *)0x0) {
                iVar26 = 0x6d;
              }
              goto LAB_0011577b;
            }
            pVar20.len = pStack_560.len;
            pVar20.base = pStack_560.base;
            iVar26 = (*local_568->exchange)(local_568,&local_538,&local_548,pVar20);
            if (iVar26 != 0) goto LAB_0011577b;
            tls->key_share = ppVar23;
          }
          iVar26 = (*emitter->begin_message)(emitter);
          if (iVar26 != 0) goto LAB_0011577b;
          ppVar9 = emitter->buf;
          ppVar34 = tls->key_schedule;
          sVar37 = ppVar9->off;
          iVar26 = ptls_buffer_reserve(ppVar9,1);
          if (iVar26 != 0) goto LAB_0011577b;
          ppVar9->base[ppVar9->off] = '\x02';
          ppVar9->off = ppVar9->off + 1;
          iVar26 = ptls_buffer_reserve(ppVar9,3);
          if (iVar26 != 0) goto LAB_0011577b;
          puVar35 = ppVar9->base;
          sVar64 = ppVar9->off;
          puVar35[sVar64 + 2] = '\0';
          puVar35 = puVar35 + sVar64;
          puVar35[0] = '\0';
          puVar35[1] = '\0';
          local_610 = ppVar9->off;
          sVar64 = local_610 + 3;
          ppVar9->off = sVar64;
          ppVar10 = emitter->buf;
          iVar26 = ptls_buffer_reserve(ppVar10,2);
          if (iVar26 != 0) goto LAB_0011577b;
          puVar35 = ppVar10->base;
          sVar54 = ppVar10->off;
          (puVar35 + sVar54)[0] = '\x03';
          (puVar35 + sVar54)[1] = '\x03';
          ppVar10->off = ppVar10->off + 2;
          iVar26 = ptls_buffer_reserve(emitter->buf,0x20);
          if (iVar26 != 0) goto LAB_0011577b;
          (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
          ppVar10 = emitter->buf;
          ppVar10->off = ppVar10->off + 0x20;
          iVar26 = ptls_buffer_reserve(ppVar10,1);
          if (iVar26 != 0) goto LAB_0011577b;
          ppVar10->base[ppVar10->off] = '\0';
          ppVar10->off = ppVar10->off + 1;
          sVar54 = emitter->buf->off;
          iVar26 = ptls_buffer__do_pushv
                             (emitter->buf,local_518.legacy_session_id.base,
                              local_518.legacy_session_id.len);
          if (iVar26 != 0) goto LAB_0011577b;
          emitter->buf->base[sVar54 - 1] = (char)(int)emitter->buf->off - (char)sVar54;
          uVar4 = tls->cipher_suite->id;
          ppVar10 = emitter->buf;
          iVar26 = ptls_buffer_reserve(ppVar10,2);
          if (iVar26 != 0) goto LAB_0011577b;
          *(ushort *)(ppVar10->base + ppVar10->off) = uVar4 << 8 | uVar4 >> 8;
          ppVar10->off = ppVar10->off + 2;
          ppVar10 = emitter->buf;
          iVar26 = ptls_buffer_reserve(ppVar10,1);
          if (iVar26 != 0) goto LAB_0011577b;
          ppVar10->base[ppVar10->off] = '\0';
          ppVar10->off = ppVar10->off + 1;
          ppVar10 = emitter->buf;
          iVar26 = ptls_buffer_reserve(ppVar10,2);
          if (iVar26 != 0) goto LAB_0011577b;
          puVar35 = ppVar10->base;
          sVar54 = ppVar10->off;
          (puVar35 + sVar54)[0] = '\0';
          (puVar35 + sVar54)[1] = '\0';
          ppVar10->off = ppVar10->off + 2;
          ppVar10 = emitter->buf;
          sVar54 = ppVar10->off;
          iVar26 = ptls_buffer_reserve(ppVar10,2);
          if (iVar26 != 0) goto LAB_0011577b;
          puVar35 = ppVar10->base;
          sVar38 = ppVar10->off;
          (puVar35 + sVar38)[0] = '\0';
          (puVar35 + sVar38)[1] = '+';
          ppVar10->off = ppVar10->off + 2;
          ppVar10 = emitter->buf;
          iVar26 = ptls_buffer_reserve(ppVar10,2);
          uVar21 = local_518.selected_version;
          if (iVar26 != 0) goto LAB_0011577b;
          puVar35 = ppVar10->base;
          sVar38 = ppVar10->off;
          (puVar35 + sVar38)[0] = '\0';
          (puVar35 + sVar38)[1] = '\0';
          ppVar10->off = ppVar10->off + 2;
          ppVar10 = emitter->buf;
          sVar38 = ppVar10->off;
          iVar26 = ptls_buffer_reserve(ppVar10,2);
          if (iVar26 != 0) goto LAB_0011577b;
          *(uint16_t *)(ppVar10->base + ppVar10->off) = uVar21 << 8 | uVar21 >> 8;
          ppVar10->off = ppVar10->off + 2;
          lVar52 = emitter->buf->off - sVar38;
          emitter->buf->base[sVar38 - 2] = (uint8_t)((ulong)lVar52 >> 8);
          emitter->buf->base[sVar38 - 1] = (uint8_t)lVar52;
          ppVar10 = emitter->buf;
          if ((int)local_638 == 1) {
LAB_0011772f:
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar38 = ppVar10->off;
            (puVar35 + sVar38)[0] = '\0';
            (puVar35 + sVar38)[1] = ')';
            ppVar10->off = ppVar10->off + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar38 = ppVar10->off;
            (puVar35 + sVar38)[0] = '\0';
            (puVar35 + sVar38)[1] = '\0';
            sVar38 = ppVar10->off;
            ppVar10->off = sVar38 + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            *(ushort *)(ppVar10->base + ppVar10->off) = (ushort)sVar55 << 8 | (ushort)sVar55 >> 8;
            sVar55 = ppVar10->off;
            ppVar10->off = sVar55 + 2;
            lVar52 = sVar55 - sVar38;
            ppVar10->base[sVar38] = (uint8_t)((ulong)lVar52 >> 8);
            ppVar10->base[sVar38 + 1] = (uint8_t)lVar52;
          }
          else {
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar38 = ppVar10->off;
            (puVar35 + sVar38)[0] = '\0';
            (puVar35 + sVar38)[1] = '3';
            ppVar10->off = ppVar10->off + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar38 = ppVar10->off;
            (puVar35 + sVar38)[0] = '\0';
            (puVar35 + sVar38)[1] = '\0';
            sVar38 = ppVar10->off;
            ppVar10->off = sVar38 + 2;
            uVar4 = local_568->id;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            *(ushort *)(ppVar10->base + ppVar10->off) = uVar4 << 8 | uVar4 >> 8;
            ppVar10->off = ppVar10->off + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar14 = ppVar10->off;
            (puVar35 + sVar14)[0] = '\0';
            (puVar35 + sVar14)[1] = '\0';
            sVar14 = ppVar10->off;
            ppVar10->off = sVar14 + 2;
            iVar26 = ptls_buffer__do_pushv(ppVar10,local_538.base,local_538.len);
            if (iVar26 != 0) goto LAB_0011577b;
            lVar52 = ppVar10->off - (sVar14 + 2);
            ppVar10->base[sVar14] = (uint8_t)((ulong)lVar52 >> 8);
            ppVar10->base[sVar14 + 1] = (uint8_t)lVar52;
            lVar52 = ppVar10->off - (sVar38 + 2);
            ppVar10->base[sVar38] = (uint8_t)((ulong)lVar52 >> 8);
            ppVar10->base[sVar38 + 1] = (uint8_t)lVar52;
            if ((int)local_638 != 0) goto LAB_0011772f;
          }
          lVar52 = emitter->buf->off - sVar54;
          emitter->buf->base[sVar54 - 2] = (uint8_t)((ulong)lVar52 >> 8);
          emitter->buf->base[sVar54 - 1] = (uint8_t)lVar52;
          sVar55 = ppVar9->off;
          lVar52 = 0x10;
          do {
            ppVar9->base[local_610] = (uint8_t)(sVar55 - sVar64 >> ((byte)lVar52 & 0x3f));
            lVar52 = lVar52 + -8;
            local_610 = local_610 + 1;
          } while (lVar52 != -8);
          if ((ppVar34 != (ptls_key_schedule_t *)0x0) && (ppVar34->num_hashes != 0)) {
            puVar35 = ppVar9->base;
            sVar55 = ppVar9->off;
            pppVar43 = &ppVar34->hashes[0].ctx;
            sVar64 = 0;
            do {
              (*(*pppVar43)->update)(*pppVar43,puVar35 + sVar37,sVar55 - sVar37);
              sVar64 = sVar64 + 1;
              pppVar43 = pppVar43 + 2;
            } while (sVar64 != ppVar34->num_hashes);
          }
          iVar26 = (*emitter->commit_message)(emitter);
          if ((iVar26 != 0) || (iVar26 = push_change_cipher_spec(tls,emitter->buf), iVar26 != 0))
          goto LAB_0011577b;
          if (tls->key_schedule->generation != 1) {
            __assert_fail("tls->key_schedule->generation == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                          ,0xf19,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          ikm.len = local_548.len;
          ikm.base = local_548.base;
          key_schedule_extract(tls->key_schedule,ikm);
          iVar26 = setup_traffic_protection(tls,1,"s hs traffic",2,0);
          if (iVar26 != 0) goto LAB_0011577b;
          if (tls->pending_handshake_secret == (uint8_t *)0x0) {
            iVar26 = setup_traffic_protection(tls,0,"c hs traffic",2,0);
            if (iVar26 != 0) goto LAB_0011577b;
            if (local_518.psk.early_data_indication != 0) {
              (tls->field_20).server.early_data_skipped_bytes = 0;
            }
          }
          else {
            iVar26 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
            if ((iVar26 != 0) ||
               ((psVar13 = tls->ctx->update_traffic_key,
                psVar13 != (st_ptls_update_traffic_key_t *)0x0 &&
                (iVar26 = (*psVar13->cb)(psVar13,tls,0,2,tls->pending_handshake_secret), iVar26 != 0
                )))) goto LAB_0011577b;
          }
          iVar26 = (*emitter->begin_message)(emitter);
          if (iVar26 != 0) goto LAB_0011577b;
          ppVar9 = emitter->buf;
          ppVar34 = tls->key_schedule;
          sVar55 = ppVar9->off;
          iVar26 = ptls_buffer_reserve(ppVar9,1);
          if (iVar26 != 0) goto LAB_0011577b;
          ppVar9->base[ppVar9->off] = '\b';
          ppVar9->off = ppVar9->off + 1;
          iVar26 = ptls_buffer_reserve(ppVar9,3);
          if (iVar26 != 0) goto LAB_0011577b;
          puVar35 = ppVar9->base;
          sVar37 = ppVar9->off;
          puVar35[sVar37 + 2] = '\0';
          puVar35 = puVar35 + sVar37;
          puVar35[0] = '\0';
          puVar35[1] = '\0';
          local_618 = (st_ptls_key_exchange_context_t **)ppVar9->off;
          sVar37 = (long)local_618 + 3;
          ppVar9->off = sVar37;
          ppVar10 = emitter->buf;
          iVar26 = ptls_buffer_reserve(ppVar10,2);
          if (iVar26 != 0) goto LAB_0011577b;
          puVar35 = ppVar10->base;
          sVar64 = ppVar10->off;
          (puVar35 + sVar64)[0] = '\0';
          (puVar35 + sVar64)[1] = '\0';
          sVar64 = ppVar10->off;
          ppVar10->off = sVar64 + 2;
          if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
            if (tls->server_name != (char *)0x0) {
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar35 = ppVar10->base;
              sVar54 = ppVar10->off;
              (puVar35 + sVar54)[0] = '\0';
              (puVar35 + sVar54)[1] = '\0';
              ppVar10->off = ppVar10->off + 2;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar35 = ppVar10->base;
              sVar54 = ppVar10->off;
              (puVar35 + sVar54)[0] = '\0';
              (puVar35 + sVar54)[1] = '\0';
              sVar54 = ppVar10->off;
              ppVar10->off = sVar54 + 2;
              ppVar10->base[sVar54] = '\0';
              ppVar10->base[sVar54 + 1] = '\0';
            }
          }
          else {
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar54 = ppVar10->off;
            (puVar35 + sVar54)[0] = 0xff;
            (puVar35 + sVar54)[1] = 0xce;
            ppVar10->off = ppVar10->off + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar54 = ppVar10->off;
            (puVar35 + sVar54)[0] = '\0';
            (puVar35 + sVar54)[1] = '\0';
            sVar54 = ppVar10->off;
            ppVar10->off = sVar54 + 2;
            psVar32 = tls->esni;
            iVar26 = ptls_buffer_reserve(ppVar10,0x10);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar38 = ppVar10->off;
            uVar16 = *(undefined8 *)(psVar32->nonce + 8);
            *(undefined8 *)(puVar35 + sVar38) = *(undefined8 *)psVar32->nonce;
            *(undefined8 *)(puVar35 + sVar38 + 8) = uVar16;
            sVar38 = ppVar10->off + 0x10;
            ppVar10->off = sVar38;
            lVar52 = sVar38 - (sVar54 + 2);
            ppVar10->base[sVar54] = (uint8_t)((ulong)lVar52 >> 8);
            ppVar10->base[sVar54 + 1] = (uint8_t)lVar52;
            free_esni_secret(&tls->esni,1);
          }
          if (tls->negotiated_protocol != (char *)0x0) {
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar54 = ppVar10->off;
            (puVar35 + sVar54)[0] = '\0';
            (puVar35 + sVar54)[1] = '\x10';
            ppVar10->off = ppVar10->off + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar54 = ppVar10->off;
            (puVar35 + sVar54)[0] = '\0';
            (puVar35 + sVar54)[1] = '\0';
            sVar54 = ppVar10->off;
            ppVar10->off = sVar54 + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar38 = ppVar10->off;
            (puVar35 + sVar38)[0] = '\0';
            (puVar35 + sVar38)[1] = '\0';
            sVar38 = ppVar10->off;
            ppVar10->off = sVar38 + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,1);
            if (iVar26 != 0) goto LAB_0011577b;
            ppVar10->base[ppVar10->off] = '\0';
            sVar14 = ppVar10->off;
            sVar63 = sVar14 + 1;
            ppVar10->off = sVar63;
            pcVar7 = tls->negotiated_protocol;
            sVar31 = strlen(pcVar7);
            iVar26 = ptls_buffer__do_pushv(ppVar10,pcVar7,sVar31);
            if (iVar26 != 0) goto LAB_0011577b;
            ppVar10->base[sVar14] = (char)(int)ppVar10->off - (char)sVar63;
            lVar52 = ppVar10->off - (sVar38 + 2);
            ppVar10->base[sVar38] = (uint8_t)((ulong)lVar52 >> 8);
            ppVar10->base[sVar38 + 1] = (uint8_t)lVar52;
            lVar52 = ppVar10->off - (sVar54 + 2);
            ppVar10->base[sVar54] = (uint8_t)((ulong)lVar52 >> 8);
            ppVar10->base[sVar54 + 1] = (uint8_t)lVar52;
          }
          if (tls->pending_handshake_secret != (uint8_t *)0x0) {
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar54 = ppVar10->off;
            (puVar35 + sVar54)[0] = '\0';
            (puVar35 + sVar54)[1] = '*';
            ppVar10->off = ppVar10->off + 2;
            iVar26 = ptls_buffer_reserve(ppVar10,2);
            if (iVar26 != 0) goto LAB_0011577b;
            puVar35 = ppVar10->base;
            sVar54 = ppVar10->off;
            (puVar35 + sVar54)[0] = '\0';
            (puVar35 + sVar54)[1] = '\0';
            sVar54 = ppVar10->off;
            ppVar10->off = sVar54 + 2;
            ppVar10->base[sVar54] = '\0';
            ppVar10->base[sVar54 + 1] = '\0';
          }
          iVar26 = push_additional_extensions(properties,ppVar10);
          if (iVar26 != 0) goto LAB_0011577b;
          lVar52 = ppVar10->off - (sVar64 + 2);
          ppVar10->base[sVar64] = (uint8_t)((ulong)lVar52 >> 8);
          ppVar10->base[sVar64 + 1] = (uint8_t)lVar52;
          sVar64 = ppVar9->off;
          lVar52 = 0x10;
          do {
            ppVar9->base[(long)local_618] = (uint8_t)(sVar64 - sVar37 >> ((byte)lVar52 & 0x3f));
            lVar52 = lVar52 + -8;
            local_618 = (st_ptls_key_exchange_context_t **)((long)local_618 + 1);
          } while (lVar52 != -8);
          if ((ppVar34 != (ptls_key_schedule_t *)0x0) && (ppVar34->num_hashes != 0)) {
            puVar35 = ppVar9->base;
            sVar37 = ppVar9->off;
            pppVar43 = &ppVar34->hashes[0].ctx;
            sVar64 = 0;
            do {
              (*(*pppVar43)->update)(*pppVar43,puVar35 + sVar55,sVar37 - sVar55);
              sVar64 = sVar64 + 1;
              pppVar43 = pppVar43 + 2;
            } while (sVar64 != ppVar34->num_hashes);
          }
          iVar26 = (*emitter->commit_message)(emitter);
          if (iVar26 != 0) goto LAB_0011577b;
          if ((int)local_638 == 0) {
            if ((tls->ctx->field_0x68 & 8) != 0) {
              iVar26 = (*emitter->begin_message)(emitter);
              if (iVar26 != 0) goto LAB_0011577b;
              ppVar9 = emitter->buf;
              ppVar34 = tls->key_schedule;
              sVar55 = ppVar9->off;
              iVar26 = ptls_buffer_reserve(ppVar9,1);
              if (iVar26 != 0) goto LAB_0011577b;
              ppVar9->base[ppVar9->off] = '\r';
              ppVar9->off = ppVar9->off + 1;
              iVar26 = ptls_buffer_reserve(ppVar9,3);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar35 = ppVar9->base;
              sVar37 = ppVar9->off;
              puVar35[sVar37 + 2] = '\0';
              puVar35 = puVar35 + sVar37;
              puVar35[0] = '\0';
              puVar35[1] = '\0';
              local_630 = (st_ptls_aead_context_t *)ppVar9->off;
              sVar37 = (long)local_630 + 3;
              ppVar9->off = sVar37;
              ppVar10 = emitter->buf;
              iVar26 = ptls_buffer_reserve(ppVar10,1);
              if (iVar26 != 0) goto LAB_0011577b;
              ppVar10->base[ppVar10->off] = '\0';
              ppVar10->off = ppVar10->off + 1;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar35 = ppVar10->base;
              sVar64 = ppVar10->off;
              (puVar35 + sVar64)[0] = '\0';
              (puVar35 + sVar64)[1] = '\0';
              sVar64 = ppVar10->off;
              ppVar10->off = sVar64 + 2;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar35 = ppVar10->base;
              sVar54 = ppVar10->off;
              (puVar35 + sVar54)[0] = '\0';
              (puVar35 + sVar54)[1] = '\r';
              ppVar10->off = ppVar10->off + 2;
              iVar26 = ptls_buffer_reserve(ppVar10,2);
              if (iVar26 != 0) goto LAB_0011577b;
              puVar35 = ppVar10->base;
              sVar54 = ppVar10->off;
              (puVar35 + sVar54)[0] = '\0';
              (puVar35 + sVar54)[1] = '\0';
              sVar54 = ppVar10->off;
              ppVar10->off = sVar54 + 2;
              iVar26 = push_signature_algorithms(ppVar10);
              if (iVar26 != 0) goto LAB_0011577b;
              lVar52 = ppVar10->off - (sVar54 + 2);
              ppVar10->base[sVar54] = (uint8_t)((ulong)lVar52 >> 8);
              ppVar10->base[sVar54 + 1] = (uint8_t)lVar52;
              lVar52 = ppVar10->off - (sVar64 + 2);
              ppVar10->base[sVar64] = (uint8_t)((ulong)lVar52 >> 8);
              ppVar10->base[sVar64 + 1] = (uint8_t)lVar52;
              sVar64 = ppVar9->off;
              lVar52 = 0x10;
              do {
                ppVar9->base[(long)local_630] = (uint8_t)(sVar64 - sVar37 >> ((byte)lVar52 & 0x3f));
                lVar52 = lVar52 + -8;
                local_630 = (st_ptls_aead_context_t *)((long)local_630 + 1);
              } while (lVar52 != -8);
              if ((ppVar34 != (ptls_key_schedule_t *)0x0) && (ppVar34->num_hashes != 0)) {
                puVar35 = ppVar9->base;
                sVar37 = ppVar9->off;
                pppVar43 = &ppVar34->hashes[0].ctx;
                sVar64 = 0;
                do {
                  (*(*pppVar43)->update)(*pppVar43,puVar35 + sVar55,sVar37 - sVar55);
                  sVar64 = sVar64 + 1;
                  pppVar43 = pppVar43 + 2;
                } while (sVar64 != ppVar34->num_hashes);
              }
              iVar26 = (*emitter->commit_message)(emitter);
              if (iVar26 != 0) goto LAB_0011577b;
            }
            goto LAB_001156c8;
          }
          goto LAB_00115707;
        }
        free(local_630);
        iVar26 = 0x33;
LAB_00118164:
        (*ctx->dispose_crypto)(ctx);
        (*ptls_clear_memory)(ctx->static_iv,ctx->algo->iv_size);
        local_630 = ctx;
LAB_00118188:
        free(local_630);
      }
      else {
        free(local_630);
        if (ctx != (st_ptls_aead_context_t *)0x0) goto LAB_00118164;
      }
    }
  }
  goto LAB_0011790c;
code_r0x00117860:
  ppVar44 = local_618[1];
  local_618 = local_618 + 1;
  if (ppVar44 == (ptls_key_exchange_context_t *)0x0) {
LAB_0011790c:
    if (*esni != (st_ptls_esni_secret_t *)0x0) {
      free_esni_secret(esni,1);
    }
    goto LAB_0011577b;
  }
  goto LAB_00117858;
LAB_0011636d:
  bVar65 = uVar4 == 0x29;
  psVar62 = psVar56;
LAB_001162d7:
  ppVar48 = local_518.esni.cipher;
  puVar61 = local_518.random_bytes;
  iVar26 = 0x32;
  if (psVar62 == psVar1) {
    lVar52 = 0;
    iVar26 = 0x46;
    do {
      if (*(uint16_t *)((long)supported_versions + lVar52) == local_518.selected_version) {
        iVar26 = 0x2f;
        if (((local_518.compression_methods.count != 1) ||
            (*local_518.compression_methods.ids != '\0')) ||
           ((local_518.esni.cipher != (ptls_cipher_suite_t *)0x0 &&
            ((st_ptls_aead_context_t *)local_518.key_shares.base == (st_ptls_aead_context_t *)0x0)))
           ) break;
        if ((st_ptls_aead_context_t *)local_518.psk.hash_end == (st_ptls_aead_context_t *)0x0) {
          if (local_518.psk.early_data_indication != 0) break;
        }
        else if (!bVar65) break;
        ppVar30 = tls->ctx;
        if ((ppVar30->field_0x68 & 1) != 0) {
          local_518.psk.ke_modes = local_518.psk.ke_modes & 0xfffffffe;
        }
        if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
          uVar16 = *(undefined8 *)local_518.random_bytes;
          uVar17 = *(undefined8 *)(local_518.random_bytes + 8);
          uVar18 = *(undefined8 *)(local_518.random_bytes + 0x18);
          *(undefined8 *)(tls->client_random + 0x10) =
               *(undefined8 *)(local_518.random_bytes + 0x10);
          *(undefined8 *)(tls->client_random + 0x18) = uVar18;
          *(undefined8 *)tls->client_random = uVar16;
          *(undefined8 *)(tls->client_random + 8) = uVar17;
          if ((local_518.esni.cipher == (ptls_cipher_suite_t *)0x0) ||
             (ppVar30->esni == (ptls_esni_context_t **)0x0)) {
            bVar65 = true;
            local_630 = (st_ptls_aead_context_t *)local_518.server_name.base;
            if ((st_ptls_aead_context_t *)local_518.server_name.base ==
                (st_ptls_aead_context_t *)0x0) {
              local_618 = (st_ptls_key_exchange_context_t **)0x0;
              local_630 = (st_ptls_aead_context_t *)0x0;
            }
            else {
              local_618 = (st_ptls_key_exchange_context_t **)local_518.server_name.len;
            }
            local_628._0_1_ = '\0';
            goto LAB_001165cc;
          }
          local_5d8 = (st_ptls_aead_context_t *)0x0;
          if (tls->esni != (st_ptls_esni_secret_t *)0x0) {
            __assert_fail("*secret == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                          ,0xba0,
                          "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, struct st_ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                         );
          }
          esni = &tls->esni;
          psVar32 = (st_ptls_esni_secret_t *)calloc(1,200);
          puVar60 = local_518.esni.record_digest;
          *esni = psVar32;
          if (psVar32 == (st_ptls_esni_secret_t *)0x0) goto LAB_001177dd;
          pppVar33 = ppVar30->esni;
          ppVar8 = *pppVar33;
          iVar25 = 0x2f;
          goto joined_r0x001164d8;
        }
        iVar26 = 0x32;
        if (local_518.psk.early_data_indication == 0) {
          iVar25 = (*ptls_mem_equal)(tls->client_random,local_518.random_bytes,0x20);
          iVar26 = 0x28;
          if ((iVar25 != 0) &&
             ((pcVar7 = tls->server_name, pcVar7 == (char *)0x0 ||
              ((sVar31 = strlen(pcVar7), local_518.server_name.len == sVar31 &&
               (iVar25 = bcmp(local_518.server_name.base,pcVar7,sVar31), iVar25 == 0))))))
          goto LAB_00116677;
        }
        break;
      }
      lVar52 = lVar52 + 2;
    } while (lVar52 != 8);
  }
LAB_0011577b:
  free(local_538.base);
  free(local_548.base);
  (*ptls_clear_memory)(&local_5c8,0x40);
  return iVar26;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch.legacy_session_id.base, ch.legacy_session_id.len); });         \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch.selected_version); });                                     \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }